

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution1d_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::Convolution1D_x86_avx::forward
          (Convolution1D_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  undefined4 uVar7;
  void *pvVar8;
  undefined4 *puVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  int *piVar17;
  undefined1 auVar18 [16];
  void *pvVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  ulong uVar29;
  float *pfVar30;
  float *pfVar31;
  float *pfVar32;
  uint uVar33;
  long lVar34;
  long lVar35;
  _func_int ***ppp_Var36;
  uint uVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  void *pvVar41;
  float *pfVar42;
  void *pvVar43;
  _func_int ***ppp_Var44;
  int iVar45;
  uint uVar46;
  float *pfVar47;
  int iVar48;
  uint uVar49;
  float *pfVar50;
  uint uVar51;
  long lVar52;
  int iVar53;
  long lVar54;
  uint uVar55;
  long lVar56;
  long lVar57;
  bool bVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  float fVar61;
  float fVar75;
  float fVar76;
  float sum [4];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar102 [28];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar111 [32];
  float fVar112;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  float fVar134;
  float fVar138;
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar132;
  float fVar133;
  float fVar135;
  float fVar136;
  float fVar137;
  undefined1 in_ZMM3 [64];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar142;
  undefined1 in_ZMM4 [64];
  undefined1 auVar143 [64];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [64];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [32];
  undefined1 auVar158 [32];
  undefined1 auVar157 [16];
  undefined1 auVar159 [64];
  undefined1 auVar160 [32];
  undefined1 auVar161 [64];
  float fVar162;
  float fVar164;
  float fVar165;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar169;
  float fVar170;
  undefined1 auVar163 [32];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar177;
  float fVar178;
  float fVar179;
  float fVar180;
  int elempack;
  int inh;
  ulong local_1f0;
  ulong local_1e0;
  long local_1c8;
  long local_1b8;
  undefined1 (*local_1b0) [32];
  void *local_1a0;
  ulong local_190;
  Allocator *local_188;
  Allocator *local_150;
  ulong local_140;
  ulong local_138;
  uint local_128;
  long local_120;
  undefined1 local_e8 [16];
  Mat local_d8;
  undefined8 local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  long local_60;
  long local_58;
  long local_50;
  void *local_48;
  void *local_40;
  long local_38;
  undefined1 auVar110 [32];
  
  uVar28 = bottom_blob->elemsize;
  iVar4 = (this->super_Convolution1D).kernel_w;
  iVar5 = (this->super_Convolution1D).dilation_w;
  iVar6 = bottom_blob->elempack;
  local_d8.cstep = 0;
  local_d8.data = (Allocator *)0x0;
  local_d8.refcount._0_4_ = 0;
  local_d8.refcount._4_4_ = 0;
  local_d8.elemsize._0_4_ = 0;
  local_d8.elempack = 0;
  local_d8.elemsize._4_4_ = (int)local_d8.refcount;
  local_d8.allocator = (Allocator *)local_d8.data;
  local_d8.dims = (int)local_d8.refcount;
  local_d8.w = local_d8.refcount._4_4_;
  local_d8.h = (int)local_d8.elemsize;
  local_d8.d = (int)local_d8.refcount;
  local_d8.c = local_d8.elempack;
  Convolution1D::make_padding(&this->super_Convolution1D,bottom_blob,&local_d8,opt);
  iVar45 = -100;
  if (((Allocator *)local_d8.data != (Allocator *)0x0) && ((long)local_d8.c * local_d8.cstep != 0))
  {
    lVar25 = 1;
    if (opt->use_packing_layout == true) {
      uVar33 = (this->super_Convolution1D).num_output;
      lVar25 = 8;
      if ((uVar33 & 7) != 0) {
        lVar25 = (ulong)((uVar33 & 3) == 0) * 3 + 1;
      }
    }
    Mat::create(top_blob,(local_d8.w + ~((iVar4 + -1) * iVar5)) /
                         (this->super_Convolution1D).stride_w + 1,
                (this->super_Convolution1D).num_output / (int)lVar25,
                lVar25 * (uVar28 / (ulong)(long)iVar6),(int)lVar25,opt->blob_allocator);
    iVar4 = local_d8.elempack;
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      iVar5 = (this->super_Convolution1D).kernel_w;
      uVar33 = (this->super_Convolution1D).activation_type;
      local_80 = (ulong)uVar33;
      iVar6 = (this->super_Convolution1D).dilation_w;
      lVar25 = (long)iVar6;
      iVar45 = (this->super_Convolution1D).stride_w;
      lVar26 = (long)iVar45;
      uVar20 = local_d8.h * local_d8.elempack;
      iVar21 = local_d8.w * local_d8.elempack;
      local_60 = (long)top_blob->w;
      local_88 = (long)top_blob->h * (long)top_blob->elempack;
      lVar52 = top_blob->elempack * local_60;
      iVar23 = (int)local_88;
      iVar24 = iVar23 + 7;
      if (-1 < iVar23) {
        iVar24 = iVar23;
      }
      pvVar8 = (this->super_Convolution1D).bias_data.data;
      uVar37 = iVar24 >> 3;
      lVar57 = (long)iVar21;
      iVar24 = (int)lVar52;
      if (7 < iVar23) {
        local_90 = (ulong)(iVar24 * 7);
        auVar161 = ZEXT3264(CONCAT428(0x3f000000,
                                      CONCAT424(0x3f000000,
                                                CONCAT420(0x3f000000,
                                                          CONCAT416(0x3f000000,
                                                                    CONCAT412(0x3f000000,
                                                                              CONCAT48(0x3f000000,
                                                                                                                                                                              
                                                  0x3f0000003f000000)))))));
        auVar143 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                                                                                                              
                                                  0x3f8000003f800000)))))));
        auVar159 = ZEXT1664(ZEXT816(0) << 0x40);
        local_78 = lVar57 * 4;
        local_1e0 = 0;
        do {
          lVar27 = (long)top_blob->w;
          if (0 < lVar27) {
            uVar55 = local_d8.h * local_d8.elempack;
            iVar53 = top_blob->elempack;
            local_1b0 = (undefined1 (*) [32])
                        ((int)((long)((ulong)(uint)((int)(local_1e0 * 8) >> 0x1f) << 0x20 |
                                     local_1e0 * 8 & 0xffffffff) / (long)iVar53) * lVar27 *
                         top_blob->elemsize + (long)top_blob->data);
            local_1b8 = 0;
            iVar48 = 0;
            local_1c8 = 0;
            local_188 = (Allocator *)local_78;
            do {
              auVar147 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar165 = 0.0;
              fVar166 = 0.0;
              fVar162 = 0.0;
              fVar164 = 0.0;
              fVar167 = 0.0;
              fVar168 = 0.0;
              fVar169 = 0.0;
              fVar170 = 0.0;
              if (pvVar8 != (void *)0x0) {
                pfVar47 = (float *)((long)pvVar8 + local_1e0 * 0x20);
                fVar162 = *pfVar47;
                fVar164 = pfVar47[1];
                fVar165 = pfVar47[2];
                fVar166 = pfVar47[3];
                fVar167 = pfVar47[4];
                fVar168 = pfVar47[5];
                fVar169 = pfVar47[6];
                fVar170 = pfVar47[7];
              }
              local_e8._0_4_ = iVar48;
              pfVar47 = (float *)((this->weight_data_tm).cstep * local_1e0 *
                                  (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              if ((int)uVar55 < 8) {
                fVar61 = 0.0;
                fVar75 = 0.0;
                fVar76 = 0.0;
                fVar77 = 0.0;
                fVar78 = 0.0;
                fVar79 = 0.0;
                fVar80 = 0.0;
                fVar81 = 0.0;
                fVar173 = 0.0;
                fVar174 = 0.0;
                fVar175 = 0.0;
                fVar176 = 0.0;
                fVar177 = 0.0;
                fVar178 = 0.0;
                fVar179 = 0.0;
                fVar180 = 0.0;
                uVar46 = 0;
              }
              else {
                fVar173 = 0.0;
                fVar174 = 0.0;
                fVar175 = 0.0;
                fVar176 = 0.0;
                fVar177 = 0.0;
                fVar178 = 0.0;
                fVar179 = 0.0;
                fVar180 = 0.0;
                fVar61 = 0.0;
                fVar75 = 0.0;
                fVar76 = 0.0;
                fVar77 = 0.0;
                fVar78 = 0.0;
                fVar79 = 0.0;
                fVar80 = 0.0;
                fVar81 = 0.0;
                iVar39 = 0;
                do {
                  lVar34 = (long)(iVar39 / local_d8.elempack) *
                           (long)local_d8.w *
                           CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  pfVar50 = (float *)((long)(_func_int ***)local_d8.data +
                                     lVar34 + (long)(iVar45 * local_d8.elempack * (int)local_1c8) *
                                              4);
                  if ((local_d8.elempack == 8) && (0 < iVar5)) {
                    pfVar50 = (float *)((long)(_func_int ***)local_d8.data +
                                       lVar34 + (long)iVar48 * 4);
                    iVar38 = iVar5;
                    do {
                      fVar142 = *pfVar50;
                      fVar1 = pfVar50[1];
                      fVar2 = pfVar50[2];
                      fVar138 = pfVar50[3];
                      fVar3 = pfVar50[4];
                      fVar112 = fVar138 * pfVar47[0x18] + auVar147._0_4_;
                      fVar132 = fVar138 * pfVar47[0x19] + auVar147._4_4_;
                      fVar133 = fVar138 * pfVar47[0x1a] + auVar147._8_4_;
                      fVar134 = fVar138 * pfVar47[0x1b] + auVar147._12_4_;
                      fVar135 = fVar138 * pfVar47[0x1c] + auVar147._16_4_;
                      fVar136 = fVar138 * pfVar47[0x1d] + auVar147._20_4_;
                      fVar137 = fVar138 * pfVar47[0x1e] + auVar147._24_4_;
                      fVar138 = fVar138 + auVar147._28_4_;
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar138,CONCAT424(fVar137,CONCAT420(fVar136,
                                                  CONCAT416(fVar135,CONCAT412(fVar134,CONCAT48(
                                                  fVar133,CONCAT44(fVar132,fVar112))))))));
                      fVar162 = fVar3 * pfVar47[0x20] + fVar162 + fVar142 * *pfVar47;
                      fVar164 = fVar3 * pfVar47[0x21] + fVar164 + fVar142 * pfVar47[1];
                      fVar165 = fVar3 * pfVar47[0x22] + fVar165 + fVar142 * pfVar47[2];
                      fVar166 = fVar3 * pfVar47[0x23] + fVar166 + fVar142 * pfVar47[3];
                      fVar167 = fVar3 * pfVar47[0x24] + fVar167 + fVar142 * pfVar47[4];
                      fVar168 = fVar3 * pfVar47[0x25] + fVar168 + fVar142 * pfVar47[5];
                      fVar169 = fVar3 * pfVar47[0x26] + fVar169 + fVar142 * pfVar47[6];
                      fVar170 = fVar3 + fVar170 + fVar142;
                      fVar142 = pfVar50[5];
                      fVar3 = pfVar50[6];
                      fVar173 = fVar1 * pfVar47[8] + fVar173 + fVar142 * pfVar47[0x28];
                      fVar174 = fVar1 * pfVar47[9] + fVar174 + fVar142 * pfVar47[0x29];
                      fVar175 = fVar1 * pfVar47[10] + fVar175 + fVar142 * pfVar47[0x2a];
                      fVar176 = fVar1 * pfVar47[0xb] + fVar176 + fVar142 * pfVar47[0x2b];
                      fVar177 = fVar1 * pfVar47[0xc] + fVar177 + fVar142 * pfVar47[0x2c];
                      fVar178 = fVar1 * pfVar47[0xd] + fVar178 + fVar142 * pfVar47[0x2d];
                      fVar179 = fVar1 * pfVar47[0xe] + fVar179 + fVar142 * pfVar47[0x2e];
                      fVar180 = fVar1 + fVar180 + fVar142;
                      fVar61 = fVar2 * pfVar47[0x10] + fVar61 + fVar3 * pfVar47[0x30];
                      fVar75 = fVar2 * pfVar47[0x11] + fVar75 + fVar3 * pfVar47[0x31];
                      fVar76 = fVar2 * pfVar47[0x12] + fVar76 + fVar3 * pfVar47[0x32];
                      fVar77 = fVar2 * pfVar47[0x13] + fVar77 + fVar3 * pfVar47[0x33];
                      fVar78 = fVar2 * pfVar47[0x14] + fVar78 + fVar3 * pfVar47[0x34];
                      fVar79 = fVar2 * pfVar47[0x15] + fVar79 + fVar3 * pfVar47[0x35];
                      fVar80 = fVar2 * pfVar47[0x16] + fVar80 + fVar3 * pfVar47[0x36];
                      fVar81 = fVar2 + fVar81 + fVar142;
                      fVar142 = pfVar50[7];
                      auVar147 = ZEXT3264(CONCAT428(fVar138 + fVar142,
                                                    CONCAT424(fVar137 + fVar142 * pfVar47[0x3e],
                                                              CONCAT420(fVar136 + fVar142 * pfVar47[
                                                  0x3d],CONCAT416(fVar135 + fVar142 * pfVar47[0x3c],
                                                                  CONCAT412(fVar134 + fVar142 * 
                                                  pfVar47[0x3b],
                                                  CONCAT48(fVar133 + fVar142 * pfVar47[0x3a],
                                                           CONCAT44(fVar132 + fVar142 * pfVar47[0x39
                                                  ],fVar112 + fVar142 * pfVar47[0x38]))))))));
                      pfVar47 = pfVar47 + 0x40;
                      pfVar50 = pfVar50 + iVar6 * 8;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  if ((local_d8.elempack == 4) && (iVar38 = iVar5, 0 < iVar5)) {
                    do {
                      fVar142 = *pfVar50;
                      fVar1 = pfVar50[1];
                      fVar2 = pfVar50[2];
                      fVar173 = fVar173 + fVar1 * pfVar47[8];
                      fVar174 = fVar174 + fVar1 * pfVar47[9];
                      fVar175 = fVar175 + fVar1 * pfVar47[10];
                      fVar176 = fVar176 + fVar1 * pfVar47[0xb];
                      fVar177 = fVar177 + fVar1 * pfVar47[0xc];
                      fVar178 = fVar178 + fVar1 * pfVar47[0xd];
                      fVar179 = fVar179 + fVar1 * pfVar47[0xe];
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar180 + fVar1,
                                                   CONCAT424(fVar179,CONCAT420(fVar178,CONCAT416(
                                                  fVar177,CONCAT412(fVar176,CONCAT48(fVar175,
                                                  CONCAT44(fVar174,fVar173))))))));
                      fVar138 = pfVar50[3];
                      fVar3 = pfVar50[lVar57];
                      fVar162 = fVar3 * pfVar47[0x20] + fVar162 + fVar142 * *pfVar47;
                      fVar164 = fVar3 * pfVar47[0x21] + fVar164 + fVar142 * pfVar47[1];
                      fVar165 = fVar3 * pfVar47[0x22] + fVar165 + fVar142 * pfVar47[2];
                      fVar166 = fVar3 * pfVar47[0x23] + fVar166 + fVar142 * pfVar47[3];
                      fVar167 = fVar3 * pfVar47[0x24] + fVar167 + fVar142 * pfVar47[4];
                      fVar168 = fVar3 * pfVar47[0x25] + fVar168 + fVar142 * pfVar47[5];
                      fVar169 = fVar3 * pfVar47[0x26] + fVar169 + fVar142 * pfVar47[6];
                      fVar170 = fVar3 + fVar170 + fVar142;
                      fVar142 = pfVar50[lVar57 + 1];
                      fVar3 = pfVar50[lVar57 + 2];
                      fVar173 = fVar173 + fVar142 * pfVar47[0x28];
                      fVar174 = fVar174 + fVar142 * pfVar47[0x29];
                      fVar175 = fVar175 + fVar142 * pfVar47[0x2a];
                      fVar176 = fVar176 + fVar142 * pfVar47[0x2b];
                      fVar177 = fVar177 + fVar142 * pfVar47[0x2c];
                      fVar178 = fVar178 + fVar142 * pfVar47[0x2d];
                      fVar179 = fVar179 + fVar142 * pfVar47[0x2e];
                      fVar180 = fVar180 + fVar1 + fVar142;
                      fVar61 = fVar2 * pfVar47[0x10] + fVar61 + fVar3 * pfVar47[0x30];
                      fVar75 = fVar2 * pfVar47[0x11] + fVar75 + fVar3 * pfVar47[0x31];
                      fVar76 = fVar2 * pfVar47[0x12] + fVar76 + fVar3 * pfVar47[0x32];
                      fVar77 = fVar2 * pfVar47[0x13] + fVar77 + fVar3 * pfVar47[0x33];
                      fVar78 = fVar2 * pfVar47[0x14] + fVar78 + fVar3 * pfVar47[0x34];
                      fVar79 = fVar2 * pfVar47[0x15] + fVar79 + fVar3 * pfVar47[0x35];
                      fVar80 = fVar2 * pfVar47[0x16] + fVar80 + fVar3 * pfVar47[0x36];
                      fVar81 = fVar2 + fVar81 + fVar142;
                      fVar142 = pfVar50[lVar57 + 3];
                      auVar147 = ZEXT3264(CONCAT428(fVar138 + auVar147._28_4_ + fVar142,
                                                    CONCAT424(fVar138 * pfVar47[0x1e] +
                                                              auVar147._24_4_ +
                                                              fVar142 * pfVar47[0x3e],
                                                              CONCAT420(fVar138 * pfVar47[0x1d] +
                                                                        auVar147._20_4_ +
                                                                        fVar142 * pfVar47[0x3d],
                                                                        CONCAT416(fVar138 * pfVar47[
                                                  0x1c] + auVar147._16_4_ + fVar142 * pfVar47[0x3c],
                                                  CONCAT412(fVar138 * pfVar47[0x1b] +
                                                            auVar147._12_4_ +
                                                            fVar142 * pfVar47[0x3b],
                                                            CONCAT48(fVar138 * pfVar47[0x1a] +
                                                                     auVar147._8_4_ +
                                                                     fVar142 * pfVar47[0x3a],
                                                                     CONCAT44(fVar138 * pfVar47[0x19
                                                  ] + auVar147._4_4_ + fVar142 * pfVar47[0x39],
                                                  fVar138 * pfVar47[0x18] + auVar147._0_4_ +
                                                  fVar142 * pfVar47[0x38]))))))));
                      pfVar47 = pfVar47 + 0x40;
                      pfVar50 = pfVar50 + iVar6 * 4;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  if ((local_d8.elempack == 1) && (iVar38 = iVar5, 0 < iVar5)) {
                    do {
                      fVar142 = *pfVar50;
                      fVar1 = pfVar50[lVar57];
                      fVar2 = pfVar50[iVar21 * 2];
                      fVar173 = fVar173 + fVar1 * pfVar47[8];
                      fVar174 = fVar174 + fVar1 * pfVar47[9];
                      fVar175 = fVar175 + fVar1 * pfVar47[10];
                      fVar176 = fVar176 + fVar1 * pfVar47[0xb];
                      fVar177 = fVar177 + fVar1 * pfVar47[0xc];
                      fVar178 = fVar178 + fVar1 * pfVar47[0xd];
                      fVar179 = fVar179 + fVar1 * pfVar47[0xe];
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar180 + fVar1,
                                                   CONCAT424(fVar179,CONCAT420(fVar178,CONCAT416(
                                                  fVar177,CONCAT412(fVar176,CONCAT48(fVar175,
                                                  CONCAT44(fVar174,fVar173))))))));
                      fVar138 = pfVar50[iVar21 * 3];
                      fVar3 = pfVar50[iVar21 * 4];
                      fVar162 = fVar3 * pfVar47[0x20] + fVar162 + fVar142 * *pfVar47;
                      fVar164 = fVar3 * pfVar47[0x21] + fVar164 + fVar142 * pfVar47[1];
                      fVar165 = fVar3 * pfVar47[0x22] + fVar165 + fVar142 * pfVar47[2];
                      fVar166 = fVar3 * pfVar47[0x23] + fVar166 + fVar142 * pfVar47[3];
                      fVar167 = fVar3 * pfVar47[0x24] + fVar167 + fVar142 * pfVar47[4];
                      fVar168 = fVar3 * pfVar47[0x25] + fVar168 + fVar142 * pfVar47[5];
                      fVar169 = fVar3 * pfVar47[0x26] + fVar169 + fVar142 * pfVar47[6];
                      fVar170 = fVar3 + fVar170 + fVar142;
                      fVar142 = pfVar50[iVar21 * 5];
                      fVar3 = pfVar50[iVar21 * 6];
                      fVar173 = fVar173 + fVar142 * pfVar47[0x28];
                      fVar174 = fVar174 + fVar142 * pfVar47[0x29];
                      fVar175 = fVar175 + fVar142 * pfVar47[0x2a];
                      fVar176 = fVar176 + fVar142 * pfVar47[0x2b];
                      fVar177 = fVar177 + fVar142 * pfVar47[0x2c];
                      fVar178 = fVar178 + fVar142 * pfVar47[0x2d];
                      fVar179 = fVar179 + fVar142 * pfVar47[0x2e];
                      fVar180 = fVar180 + fVar1 + fVar142;
                      fVar61 = fVar2 * pfVar47[0x10] + fVar61 + fVar3 * pfVar47[0x30];
                      fVar75 = fVar2 * pfVar47[0x11] + fVar75 + fVar3 * pfVar47[0x31];
                      fVar76 = fVar2 * pfVar47[0x12] + fVar76 + fVar3 * pfVar47[0x32];
                      fVar77 = fVar2 * pfVar47[0x13] + fVar77 + fVar3 * pfVar47[0x33];
                      fVar78 = fVar2 * pfVar47[0x14] + fVar78 + fVar3 * pfVar47[0x34];
                      fVar79 = fVar2 * pfVar47[0x15] + fVar79 + fVar3 * pfVar47[0x35];
                      fVar80 = fVar2 * pfVar47[0x16] + fVar80 + fVar3 * pfVar47[0x36];
                      fVar81 = fVar2 + fVar81 + fVar142;
                      fVar142 = pfVar50[iVar21 * 7];
                      auVar147 = ZEXT3264(CONCAT428(fVar138 + auVar147._28_4_ + fVar142,
                                                    CONCAT424(fVar138 * pfVar47[0x1e] +
                                                              auVar147._24_4_ +
                                                              fVar142 * pfVar47[0x3e],
                                                              CONCAT420(fVar138 * pfVar47[0x1d] +
                                                                        auVar147._20_4_ +
                                                                        fVar142 * pfVar47[0x3d],
                                                                        CONCAT416(fVar138 * pfVar47[
                                                  0x1c] + auVar147._16_4_ + fVar142 * pfVar47[0x3c],
                                                  CONCAT412(fVar138 * pfVar47[0x1b] +
                                                            auVar147._12_4_ +
                                                            fVar142 * pfVar47[0x3b],
                                                            CONCAT48(fVar138 * pfVar47[0x1a] +
                                                                     auVar147._8_4_ +
                                                                     fVar142 * pfVar47[0x3a],
                                                                     CONCAT44(fVar138 * pfVar47[0x19
                                                  ] + auVar147._4_4_ + fVar142 * pfVar47[0x39],
                                                  fVar138 * pfVar47[0x18] + auVar147._0_4_ +
                                                  fVar142 * pfVar47[0x38]))))))));
                      pfVar47 = pfVar47 + 0x40;
                      pfVar50 = pfVar50 + lVar25;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  iVar38 = iVar39 + 0xf;
                  iVar39 = iVar39 + 8;
                  uVar46 = uVar55 & 0xfffffff8;
                } while (iVar38 < (int)uVar55);
              }
              auVar60 = auVar147._0_32_;
              if ((int)(uVar46 | 3) < (int)uVar55) {
                uVar51 = uVar46;
                do {
                  lVar34 = (long)((int)uVar51 / local_d8.elempack) *
                           (long)local_d8.w *
                           CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  pfVar50 = (float *)((long)(_func_int ***)local_d8.data +
                                     lVar34 + (long)(iVar45 * local_d8.elempack * (int)local_1c8) *
                                              4);
                  if ((local_d8.elempack == 4) && (0 < iVar5)) {
                    pfVar50 = (float *)((long)(_func_int ***)local_d8.data +
                                       lVar34 + (long)iVar48 * 4);
                    iVar39 = iVar5;
                    do {
                      fVar142 = *pfVar50;
                      fVar162 = fVar162 + fVar142 * *pfVar47;
                      fVar164 = fVar164 + fVar142 * pfVar47[1];
                      fVar165 = fVar165 + fVar142 * pfVar47[2];
                      fVar166 = fVar166 + fVar142 * pfVar47[3];
                      fVar167 = fVar167 + fVar142 * pfVar47[4];
                      fVar168 = fVar168 + fVar142 * pfVar47[5];
                      fVar169 = fVar169 + fVar142 * pfVar47[6];
                      fVar170 = fVar170 + fVar142;
                      fVar142 = pfVar50[1];
                      fVar1 = pfVar50[2];
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(
                                                  fVar1,CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(
                                                  fVar1,fVar1))))))));
                      fVar173 = fVar173 + fVar142 * pfVar47[8];
                      fVar174 = fVar174 + fVar142 * pfVar47[9];
                      fVar175 = fVar175 + fVar142 * pfVar47[10];
                      fVar176 = fVar176 + fVar142 * pfVar47[0xb];
                      fVar177 = fVar177 + fVar142 * pfVar47[0xc];
                      fVar178 = fVar178 + fVar142 * pfVar47[0xd];
                      fVar179 = fVar179 + fVar142 * pfVar47[0xe];
                      fVar180 = fVar180 + fVar142;
                      fVar61 = fVar1 * pfVar47[0x10] + fVar61;
                      fVar75 = fVar1 * pfVar47[0x11] + fVar75;
                      fVar76 = fVar1 * pfVar47[0x12] + fVar76;
                      fVar77 = fVar1 * pfVar47[0x13] + fVar77;
                      fVar78 = fVar1 * pfVar47[0x14] + fVar78;
                      fVar79 = fVar1 * pfVar47[0x15] + fVar79;
                      fVar80 = fVar1 * pfVar47[0x16] + fVar80;
                      fVar81 = fVar142 + fVar81;
                      fVar142 = pfVar50[3];
                      auVar147 = ZEXT3264(CONCAT428(fVar142 + auVar147._28_4_,
                                                    CONCAT424(fVar142 * pfVar47[0x1e] +
                                                              auVar147._24_4_,
                                                              CONCAT420(fVar142 * pfVar47[0x1d] +
                                                                        auVar147._20_4_,
                                                                        CONCAT416(fVar142 * pfVar47[
                                                  0x1c] + auVar147._16_4_,
                                                  CONCAT412(fVar142 * pfVar47[0x1b] +
                                                            auVar147._12_4_,
                                                            CONCAT48(fVar142 * pfVar47[0x1a] +
                                                                     auVar147._8_4_,
                                                                     CONCAT44(fVar142 * pfVar47[0x19
                                                  ] + auVar147._4_4_,
                                                  fVar142 * pfVar47[0x18] + auVar147._0_4_))))))));
                      pfVar47 = pfVar47 + 0x20;
                      pfVar50 = pfVar50 + iVar6 * 4;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  if ((local_d8.elempack == 1) && (iVar39 = iVar5, 0 < iVar5)) {
                    do {
                      fVar142 = *pfVar50;
                      fVar162 = fVar162 + fVar142 * *pfVar47;
                      fVar164 = fVar164 + fVar142 * pfVar47[1];
                      fVar165 = fVar165 + fVar142 * pfVar47[2];
                      fVar166 = fVar166 + fVar142 * pfVar47[3];
                      fVar167 = fVar167 + fVar142 * pfVar47[4];
                      fVar168 = fVar168 + fVar142 * pfVar47[5];
                      fVar169 = fVar169 + fVar142 * pfVar47[6];
                      fVar170 = fVar170 + fVar142;
                      fVar142 = pfVar50[lVar57];
                      fVar1 = pfVar50[iVar21 * 2];
                      in_ZMM3 = ZEXT3264(CONCAT428(fVar1,CONCAT424(fVar1,CONCAT420(fVar1,CONCAT416(
                                                  fVar1,CONCAT412(fVar1,CONCAT48(fVar1,CONCAT44(
                                                  fVar1,fVar1))))))));
                      fVar173 = fVar173 + fVar142 * pfVar47[8];
                      fVar174 = fVar174 + fVar142 * pfVar47[9];
                      fVar175 = fVar175 + fVar142 * pfVar47[10];
                      fVar176 = fVar176 + fVar142 * pfVar47[0xb];
                      fVar177 = fVar177 + fVar142 * pfVar47[0xc];
                      fVar178 = fVar178 + fVar142 * pfVar47[0xd];
                      fVar179 = fVar179 + fVar142 * pfVar47[0xe];
                      fVar180 = fVar180 + fVar142;
                      fVar61 = fVar1 * pfVar47[0x10] + fVar61;
                      fVar75 = fVar1 * pfVar47[0x11] + fVar75;
                      fVar76 = fVar1 * pfVar47[0x12] + fVar76;
                      fVar77 = fVar1 * pfVar47[0x13] + fVar77;
                      fVar78 = fVar1 * pfVar47[0x14] + fVar78;
                      fVar79 = fVar1 * pfVar47[0x15] + fVar79;
                      fVar80 = fVar1 * pfVar47[0x16] + fVar80;
                      fVar81 = fVar142 + fVar81;
                      fVar142 = pfVar50[iVar21 * 3];
                      auVar147 = ZEXT3264(CONCAT428(fVar142 + auVar147._28_4_,
                                                    CONCAT424(fVar142 * pfVar47[0x1e] +
                                                              auVar147._24_4_,
                                                              CONCAT420(fVar142 * pfVar47[0x1d] +
                                                                        auVar147._20_4_,
                                                                        CONCAT416(fVar142 * pfVar47[
                                                  0x1c] + auVar147._16_4_,
                                                  CONCAT412(fVar142 * pfVar47[0x1b] +
                                                            auVar147._12_4_,
                                                            CONCAT48(fVar142 * pfVar47[0x1a] +
                                                                     auVar147._8_4_,
                                                                     CONCAT44(fVar142 * pfVar47[0x19
                                                  ] + auVar147._4_4_,
                                                  fVar142 * pfVar47[0x18] + auVar147._0_4_))))))));
                      pfVar47 = pfVar47 + 0x20;
                      pfVar50 = pfVar50 + lVar25;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar60 = auVar147._0_32_;
                  uVar46 = uVar51 + 4;
                  iVar39 = uVar51 + 7;
                  uVar51 = uVar46;
                } while (iVar39 < (int)uVar55);
              }
              uVar28 = (ulong)uVar46;
              if ((int)(uVar46 | 1) < (int)uVar55) {
                lVar34 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize)
                ;
                lVar35 = lVar34 * uVar28;
                lVar56 = (long)(_func_int ***)local_d8.data + lVar35 + (long)local_188;
                lVar34 = lVar34 * 2;
                lVar35 = (long)(_func_int ***)local_d8.data + lVar35 + local_1b8;
                do {
                  if (0 < iVar5) {
                    lVar54 = 0;
                    iVar39 = iVar5;
                    do {
                      fVar142 = *(float *)(lVar35 + lVar54);
                      fVar162 = fVar162 + fVar142 * *pfVar47;
                      fVar164 = fVar164 + fVar142 * pfVar47[1];
                      fVar165 = fVar165 + fVar142 * pfVar47[2];
                      fVar166 = fVar166 + fVar142 * pfVar47[3];
                      fVar167 = fVar167 + fVar142 * pfVar47[4];
                      fVar168 = fVar168 + fVar142 * pfVar47[5];
                      fVar169 = fVar169 + fVar142 * pfVar47[6];
                      fVar170 = fVar170 + fVar142;
                      fVar142 = *(float *)(lVar56 + lVar54);
                      fVar173 = fVar173 + fVar142 * pfVar47[8];
                      fVar174 = fVar174 + fVar142 * pfVar47[9];
                      fVar175 = fVar175 + fVar142 * pfVar47[10];
                      fVar176 = fVar176 + fVar142 * pfVar47[0xb];
                      fVar177 = fVar177 + fVar142 * pfVar47[0xc];
                      fVar178 = fVar178 + fVar142 * pfVar47[0xd];
                      fVar179 = fVar179 + fVar142 * pfVar47[0xe];
                      fVar180 = fVar180 + fVar142;
                      pfVar47 = pfVar47 + 0x10;
                      lVar54 = lVar54 + lVar25 * 4;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  uVar28 = uVar28 + 2;
                  uVar46 = (uint)uVar28;
                  lVar56 = lVar56 + lVar34;
                  lVar35 = lVar35 + lVar34;
                } while ((int)(uVar46 | 1) < (int)uVar55);
              }
              if ((int)uVar46 < (int)uVar55) {
                lVar34 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize)
                ;
                uVar28 = (ulong)uVar46;
                pfVar50 = (float *)((long)(_func_int ***)local_d8.data + lVar34 * uVar28 + local_1b8
                                   );
                do {
                  pfVar31 = pfVar50;
                  iVar39 = iVar5;
                  if (0 < iVar5) {
                    do {
                      fVar142 = *pfVar31;
                      fVar162 = fVar162 + fVar142 * *pfVar47;
                      fVar164 = fVar164 + fVar142 * pfVar47[1];
                      fVar165 = fVar165 + fVar142 * pfVar47[2];
                      fVar166 = fVar166 + fVar142 * pfVar47[3];
                      fVar167 = fVar167 + fVar142 * pfVar47[4];
                      fVar168 = fVar168 + fVar142 * pfVar47[5];
                      fVar169 = fVar169 + fVar142 * pfVar47[6];
                      fVar170 = fVar170 + fVar142;
                      pfVar47 = pfVar47 + 8;
                      pfVar31 = pfVar31 + lVar25;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  uVar28 = uVar28 + 1;
                  pfVar50 = (float *)((long)pfVar50 + lVar34);
                } while ((int)uVar28 < (int)uVar55);
              }
              fVar61 = fVar61 + auVar60._0_4_ + fVar173 + fVar162;
              fVar75 = fVar75 + auVar60._4_4_ + fVar174 + fVar164;
              auVar72._0_8_ = CONCAT44(fVar75,fVar61);
              auVar72._8_4_ = fVar76 + auVar60._8_4_ + fVar175 + fVar165;
              auVar72._12_4_ = fVar77 + auVar60._12_4_ + fVar176 + fVar166;
              auVar72._16_4_ = fVar78 + auVar60._16_4_ + fVar177 + fVar167;
              auVar72._20_4_ = fVar79 + auVar60._20_4_ + fVar178 + fVar168;
              auVar72._24_4_ = fVar80 + auVar60._24_4_ + fVar179 + fVar169;
              auVar72._28_4_ = fVar81 + auVar60._28_4_ + fVar180 + fVar170;
              auVar103 = auVar159._0_32_;
              fVar76 = auVar161._0_4_;
              fVar77 = auVar161._4_4_;
              fVar78 = auVar161._8_4_;
              fVar79 = auVar161._12_4_;
              fVar80 = auVar161._16_4_;
              fVar81 = auVar161._20_4_;
              fVar173 = auVar161._24_4_;
              fVar174 = auVar161._28_4_;
              auVar60 = auVar143._0_32_;
              fVar162 = auVar143._0_4_;
              fVar164 = auVar143._4_4_;
              fVar165 = auVar143._8_4_;
              fVar166 = auVar143._12_4_;
              fVar167 = auVar143._16_4_;
              fVar168 = auVar143._20_4_;
              fVar169 = auVar143._24_4_;
              fVar170 = auVar143._28_4_;
              switch(uVar33) {
              case 1:
                auVar72 = vmaxps_avx(auVar103,auVar72);
                break;
              case 2:
                auVar60 = vmaxps_avx(auVar103,auVar72);
                auVar103 = vminps_avx(auVar103,auVar72);
                fVar162 = *(this->super_Convolution1D).activation_params.data;
                in_ZMM3 = ZEXT3264(CONCAT428(fVar162,CONCAT424(fVar162,CONCAT420(fVar162,CONCAT416(
                                                  fVar162,CONCAT412(fVar162,CONCAT48(fVar162,
                                                  CONCAT44(fVar162,fVar162))))))));
                auVar72._0_4_ = fVar162 * auVar103._0_4_ + auVar60._0_4_;
                auVar72._4_4_ = fVar162 * auVar103._4_4_ + auVar60._4_4_;
                auVar72._8_4_ = fVar162 * auVar103._8_4_ + auVar60._8_4_;
                auVar72._12_4_ = fVar162 * auVar103._12_4_ + auVar60._12_4_;
                auVar72._16_4_ = fVar162 * auVar103._16_4_ + auVar60._16_4_;
                auVar72._20_4_ = fVar162 * auVar103._20_4_ + auVar60._20_4_;
                auVar72._24_4_ = fVar162 * auVar103._24_4_ + auVar60._24_4_;
                auVar72._28_4_ = auVar103._28_4_ + auVar60._28_4_;
                break;
              case 3:
                puVar9 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
                uVar7 = *puVar9;
                auVar106._4_4_ = uVar7;
                auVar106._0_4_ = uVar7;
                auVar106._8_4_ = uVar7;
                auVar106._12_4_ = uVar7;
                auVar106._16_4_ = uVar7;
                auVar106._20_4_ = uVar7;
                auVar106._24_4_ = uVar7;
                auVar106._28_4_ = uVar7;
                uVar7 = puVar9[1];
                auVar131._4_4_ = uVar7;
                auVar131._0_4_ = uVar7;
                auVar131._8_4_ = uVar7;
                auVar131._12_4_ = uVar7;
                auVar131._16_4_ = uVar7;
                auVar131._20_4_ = uVar7;
                auVar131._24_4_ = uVar7;
                auVar131._28_4_ = uVar7;
                in_ZMM3 = ZEXT3264(auVar131);
                auVar60 = vmaxps_avx(auVar72,auVar106);
                auVar72 = vminps_avx(auVar60,auVar131);
                break;
              case 4:
                auVar73._0_8_ = auVar72._0_8_ ^ 0x8000000080000000;
                auVar73._8_4_ = -auVar72._8_4_;
                auVar73._12_4_ = -auVar72._12_4_;
                auVar73._16_4_ = -auVar72._16_4_;
                auVar73._20_4_ = -auVar72._20_4_;
                auVar73._24_4_ = -auVar72._24_4_;
                auVar73._28_4_ = -auVar72._28_4_;
                auVar107._8_4_ = 0x42b0c0a5;
                auVar107._0_8_ = 0x42b0c0a542b0c0a5;
                auVar107._12_4_ = 0x42b0c0a5;
                auVar107._16_4_ = 0x42b0c0a5;
                auVar107._20_4_ = 0x42b0c0a5;
                auVar107._24_4_ = 0x42b0c0a5;
                auVar107._28_4_ = 0x42b0c0a5;
                auVar72 = vminps_avx(auVar73,auVar107);
                auVar108._8_4_ = 0xc2b0c0a5;
                auVar108._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar108._12_4_ = 0xc2b0c0a5;
                auVar108._16_4_ = 0xc2b0c0a5;
                auVar108._20_4_ = 0xc2b0c0a5;
                auVar108._24_4_ = 0xc2b0c0a5;
                auVar108._28_4_ = 0xc2b0c0a5;
                auVar103 = vmaxps_avx(auVar72,auVar108);
                auVar109._0_4_ = fVar76 + auVar103._0_4_ * 1.442695;
                auVar109._4_4_ = fVar77 + auVar103._4_4_ * 1.442695;
                auVar109._8_4_ = fVar78 + auVar103._8_4_ * 1.442695;
                auVar109._12_4_ = fVar79 + auVar103._12_4_ * 1.442695;
                auVar109._16_4_ = fVar80 + auVar103._16_4_ * 1.442695;
                auVar109._20_4_ = fVar81 + auVar103._20_4_ * 1.442695;
                auVar109._24_4_ = fVar173 + auVar103._24_4_ * 1.442695;
                auVar109._28_4_ = fVar174 + 1.442695;
                auVar111 = vroundps_avx(auVar109,1);
                auVar72 = vcmpps_avx(auVar109,auVar111,1);
                auVar72 = vandps_avx(auVar72,auVar60);
                auVar72 = vsubps_avx(auVar111,auVar72);
                fVar61 = auVar103._0_4_ + auVar72._0_4_ * -0.6931472;
                fVar75 = auVar103._4_4_ + auVar72._4_4_ * -0.6931472;
                fVar174 = auVar103._8_4_ + auVar72._8_4_ * -0.6931472;
                fVar175 = auVar103._12_4_ + auVar72._12_4_ * -0.6931472;
                fVar176 = auVar103._16_4_ + auVar72._16_4_ * -0.6931472;
                fVar177 = auVar103._20_4_ + auVar72._20_4_ * -0.6931472;
                fVar178 = auVar103._24_4_ + auVar72._24_4_ * -0.6931472;
                auVar82._0_4_ = (int)auVar72._0_4_;
                auVar82._4_4_ = (int)auVar72._4_4_;
                auVar82._8_4_ = (int)auVar72._8_4_;
                auVar82._12_4_ = (int)auVar72._12_4_;
                auVar110._16_4_ = (int)auVar72._16_4_;
                auVar110._0_16_ = auVar82;
                auVar110._20_4_ = (int)auVar72._20_4_;
                auVar110._24_4_ = (int)auVar72._24_4_;
                auVar110._28_4_ = (int)auVar72._28_4_;
                auVar144 = vpslld_avx(auVar82,0x17);
                auVar113 = vpslld_avx(auVar110._16_16_,0x17);
                auVar59._8_4_ = 0x3f800000;
                auVar59._0_8_ = 0x3f8000003f800000;
                auVar59._12_4_ = 0x3f800000;
                auVar113 = vpaddd_avx(auVar113,auVar59);
                auVar144 = vpaddd_avx(auVar144,auVar59);
                in_ZMM3 = ZEXT1664(auVar144);
                auVar74._0_4_ =
                     (fVar61 + fVar162 +
                     fVar61 * fVar61 *
                     (fVar76 + ((((fVar61 * 0.00019875691 + 0.0013981999) * fVar61 + 0.008333452) *
                                 fVar61 + 0.041665796) * fVar61 + 0.16666666) * fVar61)) *
                     auVar144._0_4_ + fVar162;
                auVar74._4_4_ =
                     (fVar75 + fVar164 +
                     fVar75 * fVar75 *
                     (fVar77 + ((((fVar75 * 0.00019875691 + 0.0013981999) * fVar75 + 0.008333452) *
                                 fVar75 + 0.041665796) * fVar75 + 0.16666666) * fVar75)) *
                     auVar144._4_4_ + fVar164;
                auVar74._8_4_ =
                     (fVar174 + fVar165 +
                     fVar174 * fVar174 *
                     (fVar78 + ((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452)
                                 * fVar174 + 0.041665796) * fVar174 + 0.16666666) * fVar174)) *
                     auVar144._8_4_ + fVar165;
                auVar74._12_4_ =
                     (fVar175 + fVar166 +
                     fVar175 * fVar175 *
                     (fVar79 + ((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452)
                                 * fVar175 + 0.041665796) * fVar175 + 0.16666666) * fVar175)) *
                     auVar144._12_4_ + fVar166;
                auVar74._16_4_ =
                     (fVar176 + fVar167 +
                     fVar176 * fVar176 *
                     (fVar80 + ((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452)
                                 * fVar176 + 0.041665796) * fVar176 + 0.16666666) * fVar176)) *
                     auVar113._0_4_ + fVar167;
                auVar74._20_4_ =
                     (fVar177 + fVar168 +
                     fVar177 * fVar177 *
                     (fVar81 + ((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452)
                                 * fVar177 + 0.041665796) * fVar177 + 0.16666666) * fVar177)) *
                     auVar113._4_4_ + fVar168;
                auVar74._24_4_ =
                     (fVar178 + fVar169 +
                     fVar178 * fVar178 *
                     (fVar173 +
                     ((((fVar178 * 0.00019875691 + 0.0013981999) * fVar178 + 0.008333452) * fVar178
                      + 0.041665796) * fVar178 + 0.16666666) * fVar178)) * auVar113._8_4_ + fVar169;
                auVar74._28_4_ = auVar103._28_4_ + -0.6931472 + fVar170 + -0.6931472 + fVar170;
                auVar72 = vdivps_avx(auVar60,auVar74);
                break;
              case 5:
                auVar158._8_4_ = 0x42b0c0a5;
                auVar158._0_8_ = 0x42b0c0a542b0c0a5;
                auVar158._12_4_ = 0x42b0c0a5;
                auVar158._16_4_ = 0x42b0c0a5;
                auVar158._20_4_ = 0x42b0c0a5;
                auVar158._24_4_ = 0x42b0c0a5;
                auVar158._28_4_ = 0x42b0c0a5;
                auVar103 = vminps_avx(auVar158,auVar72);
                auVar160._8_4_ = 0xc2b0c0a5;
                auVar160._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar160._12_4_ = 0xc2b0c0a5;
                auVar160._16_4_ = 0xc2b0c0a5;
                auVar160._20_4_ = 0xc2b0c0a5;
                auVar160._24_4_ = 0xc2b0c0a5;
                auVar160._28_4_ = 0xc2b0c0a5;
                auVar111 = vmaxps_avx(auVar160,auVar103);
                auVar124._0_4_ = fVar76 + auVar111._0_4_ * 1.442695;
                auVar124._4_4_ = fVar77 + auVar111._4_4_ * 1.442695;
                auVar124._8_4_ = fVar78 + auVar111._8_4_ * 1.442695;
                auVar124._12_4_ = fVar79 + auVar111._12_4_ * 1.442695;
                auVar124._16_4_ = fVar80 + auVar111._16_4_ * 1.442695;
                auVar124._20_4_ = fVar81 + auVar111._20_4_ * 1.442695;
                auVar124._24_4_ = fVar173 + auVar111._24_4_ * 1.442695;
                auVar124._28_4_ = fVar174 + in_ZMM3._28_4_;
                auVar130 = vroundps_avx(auVar124,1);
                auVar103 = vcmpps_avx(auVar124,auVar130,1);
                auVar103 = vandps_avx(auVar103,auVar60);
                auVar103 = vsubps_avx(auVar130,auVar103);
                auVar14._4_4_ = auVar103._4_4_ * 0.6931472;
                auVar14._0_4_ = auVar103._0_4_ * 0.6931472;
                auVar14._8_4_ = auVar103._8_4_ * 0.6931472;
                auVar14._12_4_ = auVar103._12_4_ * 0.6931472;
                auVar14._16_4_ = auVar103._16_4_ * 0.6931472;
                auVar14._20_4_ = auVar103._20_4_ * 0.6931472;
                auVar14._24_4_ = auVar103._24_4_ * 0.6931472;
                auVar14._28_4_ = auVar130._28_4_;
                auVar111 = vsubps_avx(auVar111,auVar14);
                fVar175 = auVar111._0_4_;
                fVar176 = auVar111._4_4_;
                fVar177 = auVar111._8_4_;
                fVar178 = auVar111._12_4_;
                fVar179 = auVar111._16_4_;
                fVar180 = auVar111._20_4_;
                fVar142 = auVar111._24_4_;
                auVar113._0_4_ = (int)auVar103._0_4_;
                auVar113._4_4_ = (int)auVar103._4_4_;
                auVar113._8_4_ = (int)auVar103._8_4_;
                auVar113._12_4_ = (int)auVar103._12_4_;
                auVar125._16_4_ = (int)auVar103._16_4_;
                auVar125._0_16_ = auVar113;
                auVar125._20_4_ = (int)auVar103._20_4_;
                auVar125._24_4_ = (int)auVar103._24_4_;
                auVar125._28_4_ = (int)auVar103._28_4_;
                auVar144 = vpslld_avx(auVar113,0x17);
                auVar113 = vpslld_avx(auVar125._16_16_,0x17);
                auVar139._8_4_ = 0x3f800000;
                auVar139._0_8_ = 0x3f8000003f800000;
                auVar139._12_4_ = 0x3f800000;
                in_ZMM4 = ZEXT1664(auVar139);
                auVar113 = vpaddd_avx(auVar113,auVar139);
                auVar144 = vpaddd_avx(auVar144,auVar139);
                auVar146._0_4_ =
                     (fVar175 + fVar162 +
                     fVar175 * fVar175 *
                     (((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452) * fVar175
                       + 0.041665796) * fVar175 + 0.16666666) * fVar175 + fVar76)) * auVar144._0_4_
                     + fVar162;
                auVar146._4_4_ =
                     (fVar176 + fVar164 +
                     fVar176 * fVar176 *
                     (((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452) * fVar176
                       + 0.041665796) * fVar176 + 0.16666666) * fVar176 + fVar77)) * auVar144._4_4_
                     + fVar164;
                auVar146._8_4_ =
                     (fVar177 + fVar165 +
                     fVar177 * fVar177 *
                     (((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452) * fVar177
                       + 0.041665796) * fVar177 + 0.16666666) * fVar177 + fVar78)) * auVar144._8_4_
                     + fVar165;
                auVar146._12_4_ =
                     (fVar178 + fVar166 +
                     fVar178 * fVar178 *
                     (((((fVar178 * 0.00019875691 + 0.0013981999) * fVar178 + 0.008333452) * fVar178
                       + 0.041665796) * fVar178 + 0.16666666) * fVar178 + fVar79)) * auVar144._12_4_
                     + fVar166;
                auVar146._16_4_ =
                     (fVar179 + fVar167 +
                     fVar179 * fVar179 *
                     (((((fVar179 * 0.00019875691 + 0.0013981999) * fVar179 + 0.008333452) * fVar179
                       + 0.041665796) * fVar179 + 0.16666666) * fVar179 + fVar80)) * auVar113._0_4_
                     + fVar167;
                auVar146._20_4_ =
                     (fVar180 + fVar168 +
                     fVar180 * fVar180 *
                     (((((fVar180 * 0.00019875691 + 0.0013981999) * fVar180 + 0.008333452) * fVar180
                       + 0.041665796) * fVar180 + 0.16666666) * fVar180 + fVar81)) * auVar113._4_4_
                     + fVar168;
                auVar146._24_4_ =
                     (fVar142 + fVar169 +
                     fVar142 * fVar142 *
                     (((((fVar142 * 0.00019875691 + 0.0013981999) * fVar142 + 0.008333452) * fVar142
                       + 0.041665796) * fVar142 + 0.16666666) * fVar142 + fVar173)) * auVar113._8_4_
                     + fVar169;
                auVar146._28_4_ = auVar111._28_4_ + fVar170 + auVar130._28_4_ + fVar170;
                auVar103._8_4_ = 0x800000;
                auVar103._0_8_ = 0x80000000800000;
                auVar103._12_4_ = 0x800000;
                auVar103._16_4_ = 0x800000;
                auVar103._20_4_ = 0x800000;
                auVar103._24_4_ = 0x800000;
                auVar103._28_4_ = 0x800000;
                auVar130 = vmaxps_avx(auVar146,auVar103);
                auVar113 = vpsrld_avx(auVar130._16_16_,0x17);
                auVar156._8_4_ = 0x807fffff;
                auVar156._0_8_ = 0x807fffff807fffff;
                auVar156._12_4_ = 0x807fffff;
                auVar156._16_4_ = 0x807fffff;
                auVar156._20_4_ = 0x807fffff;
                auVar156._24_4_ = 0x807fffff;
                auVar156._28_4_ = 0x807fffff;
                auVar103 = vandps_avx(auVar130,auVar156);
                auVar14 = vorps_avx(auVar103,auVar161._0_32_);
                auVar163._8_4_ = 0x3f3504f3;
                auVar163._0_8_ = 0x3f3504f33f3504f3;
                auVar163._12_4_ = 0x3f3504f3;
                auVar163._16_4_ = 0x3f3504f3;
                auVar163._20_4_ = 0x3f3504f3;
                auVar163._24_4_ = 0x3f3504f3;
                auVar163._28_4_ = 0x3f3504f3;
                auVar111 = vcmpps_avx(auVar163,auVar14,2);
                auVar103 = vandnps_avx(auVar111,auVar14);
                fVar175 = auVar103._0_4_ + auVar14._0_4_ + -1.0;
                fVar176 = auVar103._4_4_ + auVar14._4_4_ + -1.0;
                fVar177 = auVar103._8_4_ + auVar14._8_4_ + -1.0;
                fVar178 = auVar103._12_4_ + auVar14._12_4_ + -1.0;
                fVar179 = auVar103._16_4_ + auVar14._16_4_ + -1.0;
                fVar180 = auVar103._20_4_ + auVar14._20_4_ + -1.0;
                fVar142 = auVar103._24_4_ + auVar14._24_4_ + -1.0;
                auVar113 = vpsubd_avx(auVar113,auVar111._16_16_);
                auVar144 = vpsrld_avx(auVar130._0_16_,0x17);
                auVar148._8_4_ = 0xffffff81;
                auVar148._0_8_ = 0xffffff81ffffff81;
                auVar148._12_4_ = 0xffffff81;
                auVar113 = vpaddd_avx(auVar113,auVar148);
                auVar144 = vpsubd_avx(auVar144,auVar111._0_16_);
                auVar144 = vpaddd_avx(auVar144,auVar148);
                auVar104._16_16_ = auVar113;
                auVar104._0_16_ = auVar144;
                auVar111 = vcmpps_avx(auVar146,_DAT_005f4620,2);
                auVar130 = vcvtdq2ps_avx(auVar104);
                auVar15._4_4_ =
                     (fVar176 + auVar130._4_4_ * 0.6931472 +
                     fVar176 * fVar176 *
                     (fVar176 * (fVar176 * (fVar176 * (fVar176 * (fVar176 * (fVar176 * (fVar176 * (
                                                  fVar176 * (fVar176 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._0_4_ =
                     (fVar175 + auVar130._0_4_ * 0.6931472 +
                     fVar175 * fVar175 *
                     (fVar175 * (fVar175 * (fVar175 * (fVar175 * (fVar175 * (fVar175 * (fVar175 * (
                                                  fVar175 * (fVar175 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._8_4_ =
                     (fVar177 + auVar130._8_4_ * 0.6931472 +
                     fVar177 * fVar177 *
                     (fVar177 * (fVar177 * (fVar177 * (fVar177 * (fVar177 * (fVar177 * (fVar177 * (
                                                  fVar177 * (fVar177 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._12_4_ =
                     (fVar178 + auVar130._12_4_ * 0.6931472 +
                     fVar178 * fVar178 *
                     (fVar178 * (fVar178 * (fVar178 * (fVar178 * (fVar178 * (fVar178 * (fVar178 * (
                                                  fVar178 * (fVar178 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._16_4_ =
                     (fVar179 + auVar130._16_4_ * 0.6931472 +
                     fVar179 * fVar179 *
                     (fVar179 * (fVar179 * (fVar179 * (fVar179 * (fVar179 * (fVar179 * (fVar179 * (
                                                  fVar179 * (fVar179 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._20_4_ =
                     (fVar180 + auVar130._20_4_ * 0.6931472 +
                     fVar180 * fVar180 *
                     (fVar180 * (fVar180 * (fVar180 * (fVar180 * (fVar180 * (fVar180 * (fVar180 * (
                                                  fVar180 * (fVar180 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._24_4_ =
                     (fVar142 + auVar130._24_4_ * 0.6931472 +
                     fVar142 * fVar142 *
                     (fVar142 * (fVar142 * (fVar142 * (fVar142 * (fVar142 * (fVar142 * (fVar142 * (
                                                  fVar142 * (fVar142 * 0.070376836 + -0.1151461) +
                                                  0.116769984) + -0.12420141) + 0.14249323) +
                                                  -0.16668057) + 0.20000714) + -0.24999994) +
                                0.3333333) + -0.5)) * -2.0;
                auVar15._28_4_ = auVar103._28_4_ + auVar14._28_4_ + -1.0 + auVar130._28_4_ + 0.0;
                auVar126._8_4_ = 0x7fffffff;
                auVar126._0_8_ = 0x7fffffff7fffffff;
                auVar126._12_4_ = 0x7fffffff;
                auVar126._16_4_ = 0x7fffffff;
                auVar126._20_4_ = 0x7fffffff;
                auVar126._24_4_ = 0x7fffffff;
                auVar126._28_4_ = 0x7fffffff;
                auVar103 = vblendvps_avx(auVar15,auVar126,auVar111);
                auVar127._8_4_ = 0x42b0c0a5;
                auVar127._0_8_ = 0x42b0c0a542b0c0a5;
                auVar127._12_4_ = 0x42b0c0a5;
                auVar127._16_4_ = 0x42b0c0a5;
                auVar127._20_4_ = 0x42b0c0a5;
                auVar127._24_4_ = 0x42b0c0a5;
                auVar127._28_4_ = 0x42b0c0a5;
                auVar103 = vminps_avx(auVar103,auVar127);
                auVar111 = vmaxps_avx(auVar160,auVar103);
                auVar128._0_4_ = auVar111._0_4_ * 1.442695 + fVar76;
                auVar128._4_4_ = auVar111._4_4_ * 1.442695 + fVar77;
                auVar128._8_4_ = auVar111._8_4_ * 1.442695 + fVar78;
                auVar128._12_4_ = auVar111._12_4_ * 1.442695 + fVar79;
                auVar128._16_4_ = auVar111._16_4_ * 1.442695 + fVar80;
                auVar128._20_4_ = auVar111._20_4_ * 1.442695 + fVar81;
                auVar128._24_4_ = auVar111._24_4_ * 1.442695 + fVar173;
                auVar128._28_4_ = fVar174 + 1.442695;
                auVar14 = vroundps_avx(auVar128,1);
                auVar103 = vcmpps_avx(auVar128,auVar14,1);
                auVar103 = vandps_avx(auVar103,auVar60);
                auVar103 = vsubps_avx(auVar14,auVar103);
                auVar16._4_4_ = auVar103._4_4_ * 0.6931472;
                auVar16._0_4_ = auVar103._0_4_ * 0.6931472;
                auVar16._8_4_ = auVar103._8_4_ * 0.6931472;
                auVar16._12_4_ = auVar103._12_4_ * 0.6931472;
                auVar16._16_4_ = auVar103._16_4_ * 0.6931472;
                auVar16._20_4_ = auVar103._20_4_ * 0.6931472;
                auVar16._24_4_ = auVar103._24_4_ * 0.6931472;
                auVar16._28_4_ = auVar14._28_4_;
                auVar159 = ZEXT864(0) << 0x20;
                auVar111 = vsubps_avx(auVar111,auVar16);
                fVar174 = auVar111._0_4_;
                fVar175 = auVar111._4_4_;
                fVar176 = auVar111._8_4_;
                fVar177 = auVar111._12_4_;
                fVar178 = auVar111._16_4_;
                fVar179 = auVar111._20_4_;
                fVar180 = auVar111._24_4_;
                auVar143 = ZEXT3264(auVar60);
                auVar161 = ZEXT3264(auVar161._0_32_);
                auVar144._0_4_ = (int)auVar103._0_4_;
                auVar144._4_4_ = (int)auVar103._4_4_;
                auVar144._8_4_ = (int)auVar103._8_4_;
                auVar144._12_4_ = (int)auVar103._12_4_;
                auVar129._16_4_ = (int)auVar103._16_4_;
                auVar129._0_16_ = auVar144;
                auVar129._20_4_ = (int)auVar103._20_4_;
                auVar129._24_4_ = (int)auVar103._24_4_;
                auVar129._28_4_ = (int)auVar103._28_4_;
                auVar144 = vpslld_avx(auVar144,0x17);
                auVar113 = vpslld_avx(auVar129._16_16_,0x17);
                auVar113 = vpaddd_avx(auVar113,auVar139);
                auVar144 = vpaddd_avx(auVar144,auVar139);
                auVar130._16_16_ = auVar113;
                auVar130._0_16_ = auVar144;
                auVar105._0_4_ =
                     (fVar174 + fVar162 +
                     fVar174 * fVar174 *
                     (fVar76 + ((((fVar174 * 0.00019875691 + 0.0013981999) * fVar174 + 0.008333452)
                                 * fVar174 + 0.041665796) * fVar174 + 0.16666666) * fVar174)) *
                     auVar144._0_4_ + fVar162;
                auVar105._4_4_ =
                     (fVar175 + fVar164 +
                     fVar175 * fVar175 *
                     (fVar77 + ((((fVar175 * 0.00019875691 + 0.0013981999) * fVar175 + 0.008333452)
                                 * fVar175 + 0.041665796) * fVar175 + 0.16666666) * fVar175)) *
                     auVar144._4_4_ + fVar164;
                auVar105._8_4_ =
                     (fVar176 + fVar165 +
                     fVar176 * fVar176 *
                     (fVar78 + ((((fVar176 * 0.00019875691 + 0.0013981999) * fVar176 + 0.008333452)
                                 * fVar176 + 0.041665796) * fVar176 + 0.16666666) * fVar176)) *
                     auVar144._8_4_ + fVar165;
                auVar105._12_4_ =
                     (fVar177 + fVar166 +
                     fVar177 * fVar177 *
                     (fVar79 + ((((fVar177 * 0.00019875691 + 0.0013981999) * fVar177 + 0.008333452)
                                 * fVar177 + 0.041665796) * fVar177 + 0.16666666) * fVar177)) *
                     auVar144._12_4_ + fVar166;
                auVar105._16_4_ =
                     (fVar178 + fVar167 +
                     fVar178 * fVar178 *
                     (fVar80 + ((((fVar178 * 0.00019875691 + 0.0013981999) * fVar178 + 0.008333452)
                                 * fVar178 + 0.041665796) * fVar178 + 0.16666666) * fVar178)) *
                     auVar113._0_4_ + fVar167;
                auVar105._20_4_ =
                     (fVar179 + fVar168 +
                     fVar179 * fVar179 *
                     (fVar81 + ((((fVar179 * 0.00019875691 + 0.0013981999) * fVar179 + 0.008333452)
                                 * fVar179 + 0.041665796) * fVar179 + 0.16666666) * fVar179)) *
                     auVar113._4_4_ + fVar168;
                auVar105._24_4_ =
                     (fVar180 + fVar169 +
                     fVar180 * fVar180 *
                     (fVar173 +
                     ((((fVar180 * 0.00019875691 + 0.0013981999) * fVar180 + 0.008333452) * fVar180
                      + 0.041665796) * fVar180 + 0.16666666) * fVar180)) * auVar113._8_4_ + fVar169;
                auVar105._28_4_ = auVar111._28_4_ + fVar170 + auVar14._28_4_ + fVar170;
                auVar60._8_4_ = 0x40000000;
                auVar60._0_8_ = 0x4000000040000000;
                auVar60._12_4_ = 0x40000000;
                auVar60._16_4_ = 0x40000000;
                auVar60._20_4_ = 0x40000000;
                auVar60._24_4_ = 0x40000000;
                auVar60._28_4_ = 0x40000000;
                auVar60 = vdivps_avx(auVar60,auVar105);
                auVar102._0_4_ = auVar60._0_4_ + -1.0;
                auVar102._4_4_ = auVar60._4_4_ + -1.0;
                auVar102._8_4_ = auVar60._8_4_ + -1.0;
                auVar102._12_4_ = auVar60._12_4_ + -1.0;
                auVar102._16_4_ = auVar60._16_4_ + -1.0;
                auVar102._20_4_ = auVar60._20_4_ + -1.0;
                auVar102._24_4_ = auVar60._24_4_ + -1.0;
                goto LAB_00584421;
              case 6:
                pfVar47 = (float *)(this->super_Convolution1D).activation_params.data;
                fVar162 = *pfVar47;
                fVar164 = pfVar47[1];
                auVar130._4_4_ = fVar164;
                auVar130._0_4_ = fVar164;
                auVar130._8_4_ = fVar164;
                auVar130._12_4_ = fVar164;
                auVar130._16_4_ = fVar164;
                auVar130._20_4_ = fVar164;
                auVar130._24_4_ = fVar164;
                auVar130._28_4_ = fVar164;
                auVar111._0_4_ = fVar162 * fVar61 + fVar164;
                auVar111._4_4_ = fVar162 * fVar75 + fVar164;
                auVar111._8_4_ = fVar162 * auVar72._8_4_ + fVar164;
                auVar111._12_4_ = fVar162 * auVar72._12_4_ + fVar164;
                auVar111._16_4_ = fVar162 * auVar72._16_4_ + fVar164;
                auVar111._20_4_ = fVar162 * auVar72._20_4_ + fVar164;
                auVar111._24_4_ = fVar162 * auVar72._24_4_ + fVar164;
                auVar111._28_4_ = fVar162 + fVar164;
                auVar103 = vmaxps_avx(auVar103,auVar111);
                auVar60 = vminps_avx(auVar103,auVar60);
                auVar102 = auVar60._0_28_;
LAB_00584421:
                in_ZMM3 = ZEXT3264(auVar130);
                auVar72._4_4_ = auVar102._4_4_ * fVar75;
                auVar72._0_4_ = auVar102._0_4_ * fVar61;
                auVar72._8_4_ = auVar102._8_4_ * auVar72._8_4_;
                auVar72._12_4_ = auVar102._12_4_ * auVar72._12_4_;
                auVar72._16_4_ = auVar102._16_4_ * auVar72._16_4_;
                auVar72._20_4_ = auVar102._20_4_ * auVar72._20_4_;
                auVar72._24_4_ = auVar102._24_4_ * auVar72._24_4_;
              }
              if (iVar53 == 8) {
                *local_1b0 = auVar72;
                local_1b0 = local_1b0 + 1;
              }
              auVar144 = auVar72._16_16_;
              auVar113 = auVar72._0_16_;
              if (iVar53 == 4) {
                *(undefined1 (*) [16])*local_1b0 = auVar113;
                *(undefined1 (*) [16])((long)*local_1b0 + lVar52 * 4) = auVar144;
                local_1b0 = (undefined1 (*) [32])((long)*local_1b0 + 0x10);
              }
              if (iVar53 == 1) {
                *(int *)*local_1b0 = auVar72._0_4_;
                uVar7 = vextractps_avx(auVar113,1);
                *(undefined4 *)((long)*local_1b0 + lVar52 * 4) = uVar7;
                uVar7 = vextractps_avx(auVar113,2);
                *(undefined4 *)((long)*local_1b0 + (long)(iVar24 * 2) * 4) = uVar7;
                uVar7 = vextractps_avx(auVar113,3);
                *(undefined4 *)((long)*local_1b0 + (long)(iVar24 * 3) * 4) = uVar7;
                *(int *)((long)*local_1b0 + (long)(iVar24 * 4) * 4) = auVar72._16_4_;
                uVar7 = vextractps_avx(auVar144,1);
                *(undefined4 *)((long)*local_1b0 + (long)(iVar24 * 5) * 4) = uVar7;
                uVar7 = vextractps_avx(auVar144,2);
                *(undefined4 *)((long)*local_1b0 + (long)(iVar24 * 6) * 4) = uVar7;
                uVar7 = vextractps_avx(auVar144,3);
                *(undefined4 *)((long)*local_1b0 + local_90 * 4) = uVar7;
                local_1b0 = (undefined1 (*) [32])((long)*local_1b0 + 4);
              }
              local_1c8 = local_1c8 + 1;
              iVar48 = iVar48 + iVar45 * local_d8.elempack;
              local_188 = (Allocator *)((long)local_188 + lVar26 * 4);
              local_1b8 = local_1b8 + lVar26 * 4;
            } while (local_1c8 != lVar27);
          }
          local_1e0 = local_1e0 + 1;
        } while (local_1e0 != uVar37);
      }
      iVar48 = iVar23 + uVar37 * -8;
      iVar53 = iVar48 + 3;
      if (-1 < iVar48) {
        iVar53 = iVar48;
      }
      if (3 < iVar48) {
        local_90 = lVar57 * 4;
        auVar143 = ZEXT1664(CONCAT412(0x3f000000,CONCAT48(0x3f000000,0x3f0000003f000000)));
        auVar145._8_4_ = 0x3f800000;
        auVar145._0_8_ = 0x3f8000003f800000;
        auVar145._12_4_ = 0x3f800000;
        local_140 = 0;
        do {
          lVar52 = (long)top_blob->w;
          if (0 < lVar52) {
            uVar46 = local_d8.h * local_d8.elempack;
            uVar28 = (long)(int)(uVar37 * 8) + local_140 * 4;
            iVar48 = top_blob->elempack;
            uVar51 = (uint)uVar28;
            local_1b0 = (undefined1 (*) [32])
                        ((int)((long)((ulong)(uint)((int)uVar51 >> 0x1f) << 0x20 |
                                     uVar28 & 0xffffffff) / (long)iVar48) * lVar52 *
                         top_blob->elemsize + (long)top_blob->data);
            uVar55 = uVar51 + 7;
            if (-1 < (int)uVar51) {
              uVar55 = uVar51;
            }
            local_1b8 = 0;
            iVar39 = 0;
            local_1c8 = 0;
            local_188 = (Allocator *)local_90;
            do {
              auVar159 = ZEXT1664(ZEXT816(0) << 0x40);
              fVar162 = 0.0;
              fVar164 = 0.0;
              fVar165 = 0.0;
              fVar166 = 0.0;
              if (pvVar8 != (void *)0x0) {
                pfVar47 = (float *)((long)pvVar8 + uVar28 * 4);
                fVar162 = *pfVar47;
                fVar164 = pfVar47[1];
                fVar165 = pfVar47[2];
                fVar166 = pfVar47[3];
              }
              local_e8._0_4_ = iVar39;
              pfVar47 = (float *)((this->weight_data_tm).cstep *
                                  (long)(((int)(uVar51 - (uVar55 & 0xfffffff8)) >> 2) +
                                        ((int)uVar55 >> 3)) * (this->weight_data_tm).elemsize +
                                 (long)(this->weight_data_tm).data);
              if ((int)uVar46 < 8) {
                fVar167 = 0.0;
                fVar168 = 0.0;
                fVar169 = 0.0;
                fVar170 = 0.0;
                fVar61 = 0.0;
                fVar75 = 0.0;
                fVar76 = 0.0;
                fVar77 = 0.0;
                uVar22 = 0;
              }
              else {
                fVar61 = 0.0;
                fVar75 = 0.0;
                fVar76 = 0.0;
                fVar77 = 0.0;
                fVar167 = 0.0;
                fVar168 = 0.0;
                fVar169 = 0.0;
                fVar170 = 0.0;
                iVar38 = 0;
                do {
                  lVar27 = (long)(iVar38 / local_d8.elempack) *
                           (long)local_d8.w *
                           CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  pfVar50 = (float *)((long)(_func_int ***)local_d8.data +
                                     lVar27 + (long)(local_d8.elempack * iVar45 * (int)local_1c8) *
                                              4);
                  if ((local_d8.elempack == 8) && (0 < iVar5)) {
                    pfVar50 = (float *)((long)(_func_int ***)local_d8.data +
                                       lVar27 + (long)iVar39 * 4);
                    iVar40 = iVar5;
                    do {
                      fVar78 = *pfVar50;
                      fVar79 = pfVar50[1];
                      fVar80 = pfVar50[2];
                      fVar81 = pfVar50[3];
                      fVar173 = pfVar50[4];
                      fVar162 = fVar173 * pfVar47[0x10] + fVar78 * *pfVar47 + fVar162;
                      fVar164 = fVar173 * pfVar47[0x11] + fVar78 * pfVar47[1] + fVar164;
                      fVar165 = fVar173 * pfVar47[0x12] + fVar78 * pfVar47[2] + fVar165;
                      fVar166 = fVar173 * pfVar47[0x13] + fVar78 * pfVar47[3] + fVar166;
                      fVar78 = pfVar50[5];
                      fVar61 = fVar78 * pfVar47[0x14] + fVar61 + fVar79 * pfVar47[4];
                      fVar75 = fVar78 * pfVar47[0x15] + fVar75 + fVar79 * pfVar47[5];
                      fVar76 = fVar78 * pfVar47[0x16] + fVar76 + fVar79 * pfVar47[6];
                      fVar77 = fVar78 * pfVar47[0x17] + fVar77 + fVar79 * pfVar47[7];
                      fVar78 = pfVar50[6];
                      fVar167 = fVar80 * pfVar47[8] + fVar167 + fVar78 * pfVar47[0x18];
                      fVar168 = fVar80 * pfVar47[9] + fVar168 + fVar78 * pfVar47[0x19];
                      fVar169 = fVar80 * pfVar47[10] + fVar169 + fVar78 * pfVar47[0x1a];
                      fVar170 = fVar80 * pfVar47[0xb] + fVar170 + fVar78 * pfVar47[0x1b];
                      fVar78 = pfVar50[7];
                      auVar159 = ZEXT1664(CONCAT412(fVar81 * pfVar47[0xf] + auVar159._12_4_ +
                                                    fVar78 * pfVar47[0x1f],
                                                    CONCAT48(fVar81 * pfVar47[0xe] + auVar159._8_4_
                                                             + fVar78 * pfVar47[0x1e],
                                                             CONCAT44(fVar81 * pfVar47[0xd] +
                                                                      auVar159._4_4_ +
                                                                      fVar78 * pfVar47[0x1d],
                                                                      fVar81 * pfVar47[0xc] +
                                                                      auVar159._0_4_ +
                                                                      fVar78 * pfVar47[0x1c]))));
                      pfVar47 = pfVar47 + 0x20;
                      pfVar50 = pfVar50 + iVar6 * 8;
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  if ((local_d8.elempack == 4) && (iVar40 = iVar5, 0 < iVar5)) {
                    do {
                      fVar78 = *pfVar50;
                      fVar79 = pfVar50[1];
                      fVar80 = pfVar50[2];
                      fVar81 = pfVar50[3];
                      fVar173 = pfVar50[lVar57];
                      fVar162 = fVar173 * pfVar47[0x10] + fVar78 * *pfVar47 + fVar162;
                      fVar164 = fVar173 * pfVar47[0x11] + fVar78 * pfVar47[1] + fVar164;
                      fVar165 = fVar173 * pfVar47[0x12] + fVar78 * pfVar47[2] + fVar165;
                      fVar166 = fVar173 * pfVar47[0x13] + fVar78 * pfVar47[3] + fVar166;
                      fVar78 = pfVar50[lVar57 + 1];
                      fVar61 = fVar78 * pfVar47[0x14] + fVar61 + fVar79 * pfVar47[4];
                      fVar75 = fVar78 * pfVar47[0x15] + fVar75 + fVar79 * pfVar47[5];
                      fVar76 = fVar78 * pfVar47[0x16] + fVar76 + fVar79 * pfVar47[6];
                      fVar77 = fVar78 * pfVar47[0x17] + fVar77 + fVar79 * pfVar47[7];
                      fVar78 = pfVar50[lVar57 + 2];
                      fVar167 = fVar80 * pfVar47[8] + fVar167 + fVar78 * pfVar47[0x18];
                      fVar168 = fVar80 * pfVar47[9] + fVar168 + fVar78 * pfVar47[0x19];
                      fVar169 = fVar80 * pfVar47[10] + fVar169 + fVar78 * pfVar47[0x1a];
                      fVar170 = fVar80 * pfVar47[0xb] + fVar170 + fVar78 * pfVar47[0x1b];
                      fVar78 = pfVar50[lVar57 + 3];
                      auVar159 = ZEXT1664(CONCAT412(fVar81 * pfVar47[0xf] + auVar159._12_4_ +
                                                    fVar78 * pfVar47[0x1f],
                                                    CONCAT48(fVar81 * pfVar47[0xe] + auVar159._8_4_
                                                             + fVar78 * pfVar47[0x1e],
                                                             CONCAT44(fVar81 * pfVar47[0xd] +
                                                                      auVar159._4_4_ +
                                                                      fVar78 * pfVar47[0x1d],
                                                                      fVar81 * pfVar47[0xc] +
                                                                      auVar159._0_4_ +
                                                                      fVar78 * pfVar47[0x1c]))));
                      pfVar47 = pfVar47 + 0x20;
                      pfVar50 = pfVar50 + iVar6 * 4;
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  if ((local_d8.elempack == 1) && (iVar40 = iVar5, 0 < iVar5)) {
                    do {
                      fVar78 = *pfVar50;
                      fVar79 = pfVar50[lVar57];
                      fVar80 = pfVar50[iVar21 * 2];
                      fVar81 = pfVar50[iVar21 * 3];
                      fVar173 = pfVar50[iVar21 * 4];
                      fVar162 = fVar173 * pfVar47[0x10] + fVar78 * *pfVar47 + fVar162;
                      fVar164 = fVar173 * pfVar47[0x11] + fVar78 * pfVar47[1] + fVar164;
                      fVar165 = fVar173 * pfVar47[0x12] + fVar78 * pfVar47[2] + fVar165;
                      fVar166 = fVar173 * pfVar47[0x13] + fVar78 * pfVar47[3] + fVar166;
                      fVar78 = pfVar50[iVar21 * 5];
                      fVar61 = fVar78 * pfVar47[0x14] + fVar61 + fVar79 * pfVar47[4];
                      fVar75 = fVar78 * pfVar47[0x15] + fVar75 + fVar79 * pfVar47[5];
                      fVar76 = fVar78 * pfVar47[0x16] + fVar76 + fVar79 * pfVar47[6];
                      fVar77 = fVar78 * pfVar47[0x17] + fVar77 + fVar79 * pfVar47[7];
                      fVar78 = pfVar50[iVar21 * 6];
                      fVar167 = fVar80 * pfVar47[8] + fVar167 + fVar78 * pfVar47[0x18];
                      fVar168 = fVar80 * pfVar47[9] + fVar168 + fVar78 * pfVar47[0x19];
                      fVar169 = fVar80 * pfVar47[10] + fVar169 + fVar78 * pfVar47[0x1a];
                      fVar170 = fVar80 * pfVar47[0xb] + fVar170 + fVar78 * pfVar47[0x1b];
                      fVar78 = pfVar50[iVar21 * 7];
                      auVar159 = ZEXT1664(CONCAT412(fVar81 * pfVar47[0xf] + auVar159._12_4_ +
                                                    fVar78 * pfVar47[0x1f],
                                                    CONCAT48(fVar81 * pfVar47[0xe] + auVar159._8_4_
                                                             + fVar78 * pfVar47[0x1e],
                                                             CONCAT44(fVar81 * pfVar47[0xd] +
                                                                      auVar159._4_4_ +
                                                                      fVar78 * pfVar47[0x1d],
                                                                      fVar81 * pfVar47[0xc] +
                                                                      auVar159._0_4_ +
                                                                      fVar78 * pfVar47[0x1c]))));
                      pfVar47 = pfVar47 + 0x20;
                      pfVar50 = pfVar50 + lVar25;
                      iVar40 = iVar40 + -1;
                    } while (iVar40 != 0);
                  }
                  iVar40 = iVar38 + 0xf;
                  uVar22 = uVar46 & 0xfffffff8;
                  iVar38 = iVar38 + 8;
                } while (iVar40 < (int)uVar46);
              }
              auVar113 = auVar159._0_16_;
              if ((int)(uVar22 | 3) < (int)uVar46) {
                uVar49 = uVar22;
                do {
                  lVar27 = (long)((int)uVar49 / local_d8.elempack) *
                           (long)local_d8.w *
                           CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
                  pfVar50 = (float *)((long)(_func_int ***)local_d8.data +
                                     lVar27 + (long)(local_d8.elempack * iVar45 * (int)local_1c8) *
                                              4);
                  if ((local_d8.elempack == 4) && (0 < iVar5)) {
                    pfVar50 = (float *)((long)(_func_int ***)local_d8.data +
                                       lVar27 + (long)iVar39 * 4);
                    iVar38 = iVar5;
                    do {
                      fVar78 = *pfVar50;
                      fVar162 = fVar78 * *pfVar47 + fVar162;
                      fVar164 = fVar78 * pfVar47[1] + fVar164;
                      fVar165 = fVar78 * pfVar47[2] + fVar165;
                      fVar166 = fVar78 * pfVar47[3] + fVar166;
                      fVar78 = pfVar50[1];
                      fVar61 = fVar61 + fVar78 * pfVar47[4];
                      fVar75 = fVar75 + fVar78 * pfVar47[5];
                      fVar76 = fVar76 + fVar78 * pfVar47[6];
                      fVar77 = fVar77 + fVar78 * pfVar47[7];
                      fVar78 = pfVar50[2];
                      fVar167 = fVar167 + fVar78 * pfVar47[8];
                      fVar168 = fVar168 + fVar78 * pfVar47[9];
                      fVar169 = fVar169 + fVar78 * pfVar47[10];
                      fVar170 = fVar170 + fVar78 * pfVar47[0xb];
                      fVar78 = pfVar50[3];
                      auVar159 = ZEXT1664(CONCAT412(fVar78 * pfVar47[0xf] + auVar159._12_4_,
                                                    CONCAT48(fVar78 * pfVar47[0xe] + auVar159._8_4_,
                                                             CONCAT44(fVar78 * pfVar47[0xd] +
                                                                      auVar159._4_4_,
                                                                      fVar78 * pfVar47[0xc] +
                                                                      auVar159._0_4_))));
                      pfVar47 = pfVar47 + 0x10;
                      pfVar50 = pfVar50 + iVar6 * 4;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  if ((local_d8.elempack == 1) && (iVar38 = iVar5, 0 < iVar5)) {
                    do {
                      fVar78 = *pfVar50;
                      fVar162 = fVar78 * *pfVar47 + fVar162;
                      fVar164 = fVar78 * pfVar47[1] + fVar164;
                      fVar165 = fVar78 * pfVar47[2] + fVar165;
                      fVar166 = fVar78 * pfVar47[3] + fVar166;
                      fVar78 = pfVar50[lVar57];
                      fVar61 = fVar61 + fVar78 * pfVar47[4];
                      fVar75 = fVar75 + fVar78 * pfVar47[5];
                      fVar76 = fVar76 + fVar78 * pfVar47[6];
                      fVar77 = fVar77 + fVar78 * pfVar47[7];
                      fVar78 = pfVar50[iVar21 * 2];
                      fVar167 = fVar167 + fVar78 * pfVar47[8];
                      fVar168 = fVar168 + fVar78 * pfVar47[9];
                      fVar169 = fVar169 + fVar78 * pfVar47[10];
                      fVar170 = fVar170 + fVar78 * pfVar47[0xb];
                      fVar78 = pfVar50[iVar21 * 3];
                      auVar159 = ZEXT1664(CONCAT412(fVar78 * pfVar47[0xf] + auVar159._12_4_,
                                                    CONCAT48(fVar78 * pfVar47[0xe] + auVar159._8_4_,
                                                             CONCAT44(fVar78 * pfVar47[0xd] +
                                                                      auVar159._4_4_,
                                                                      fVar78 * pfVar47[0xc] +
                                                                      auVar159._0_4_))));
                      pfVar47 = pfVar47 + 0x10;
                      pfVar50 = pfVar50 + lVar25;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  auVar113 = auVar159._0_16_;
                  uVar22 = uVar49 + 4;
                  iVar38 = uVar49 + 7;
                  uVar49 = uVar22;
                } while (iVar38 < (int)uVar46);
              }
              uVar29 = (ulong)uVar22;
              if ((int)(uVar22 | 1) < (int)uVar46) {
                lVar27 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize)
                ;
                lVar34 = lVar27 * uVar29;
                lVar35 = (long)(_func_int ***)local_d8.data + lVar34 + (long)local_188;
                lVar27 = lVar27 * 2;
                lVar34 = (long)(_func_int ***)local_d8.data + lVar34 + local_1b8;
                do {
                  if (0 < iVar5) {
                    lVar56 = 0;
                    iVar38 = iVar5;
                    do {
                      fVar78 = *(float *)(lVar34 + lVar56);
                      fVar162 = fVar78 * *pfVar47 + fVar162;
                      fVar164 = fVar78 * pfVar47[1] + fVar164;
                      fVar165 = fVar78 * pfVar47[2] + fVar165;
                      fVar166 = fVar78 * pfVar47[3] + fVar166;
                      fVar78 = *(float *)(lVar35 + lVar56);
                      fVar61 = fVar61 + fVar78 * pfVar47[4];
                      fVar75 = fVar75 + fVar78 * pfVar47[5];
                      fVar76 = fVar76 + fVar78 * pfVar47[6];
                      fVar77 = fVar77 + fVar78 * pfVar47[7];
                      pfVar47 = pfVar47 + 8;
                      lVar56 = lVar56 + lVar25 * 4;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  uVar29 = uVar29 + 2;
                  uVar22 = (uint)uVar29;
                  lVar35 = lVar35 + lVar27;
                  lVar34 = lVar34 + lVar27;
                } while ((int)(uVar22 | 1) < (int)uVar46);
              }
              if ((int)uVar22 < (int)uVar46) {
                lVar27 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize)
                ;
                uVar29 = (ulong)uVar22;
                pfVar50 = (float *)((long)(_func_int ***)local_d8.data + lVar27 * uVar29 + local_1b8
                                   );
                do {
                  pfVar31 = pfVar50;
                  iVar38 = iVar5;
                  if (0 < iVar5) {
                    do {
                      fVar78 = *pfVar31;
                      fVar162 = fVar78 * *pfVar47 + fVar162;
                      fVar164 = fVar78 * pfVar47[1] + fVar164;
                      fVar165 = fVar78 * pfVar47[2] + fVar165;
                      fVar166 = fVar78 * pfVar47[3] + fVar166;
                      pfVar47 = pfVar47 + 4;
                      pfVar31 = pfVar31 + lVar25;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  uVar29 = uVar29 + 1;
                  pfVar50 = (float *)((long)pfVar50 + lVar27);
                } while ((int)uVar29 < (int)uVar46);
              }
              auVar62._0_4_ = fVar167 + auVar113._0_4_ + fVar61 + fVar162;
              auVar62._4_4_ = fVar168 + auVar113._4_4_ + fVar75 + fVar164;
              auVar62._8_4_ = fVar169 + auVar113._8_4_ + fVar76 + fVar165;
              auVar62._12_4_ = fVar170 + auVar113._12_4_ + fVar77 + fVar166;
              fVar162 = auVar143._0_4_;
              fVar164 = auVar143._4_4_;
              fVar165 = auVar143._8_4_;
              fVar166 = auVar143._12_4_;
              switch(uVar33) {
              case 1:
                auVar62 = vmaxps_avx(auVar62,_DAT_005f00d0);
                break;
              case 2:
                auVar113 = vmaxps_avx(auVar62,ZEXT816(0) << 0x40);
                auVar144 = vminps_avx(auVar62,ZEXT816(0) << 0x40);
                fVar162 = *(this->super_Convolution1D).activation_params.data;
                auVar62._0_4_ = fVar162 * auVar144._0_4_ + auVar113._0_4_;
                auVar62._4_4_ = fVar162 * auVar144._4_4_ + auVar113._4_4_;
                auVar62._8_4_ = fVar162 * auVar144._8_4_ + auVar113._8_4_;
                auVar62._12_4_ = fVar162 * auVar144._12_4_ + auVar113._12_4_;
                break;
              case 3:
                puVar9 = (undefined4 *)(this->super_Convolution1D).activation_params.data;
                uVar7 = *puVar9;
                auVar87._4_4_ = uVar7;
                auVar87._0_4_ = uVar7;
                auVar87._8_4_ = uVar7;
                auVar87._12_4_ = uVar7;
                uVar7 = puVar9[1];
                auVar154._4_4_ = uVar7;
                auVar154._0_4_ = uVar7;
                auVar154._8_4_ = uVar7;
                auVar154._12_4_ = uVar7;
                auVar113 = vmaxps_avx(auVar62,auVar87);
                auVar62 = vminps_avx(auVar113,auVar154);
                break;
              case 4:
                uVar29 = CONCAT44(auVar62._4_4_,auVar62._0_4_);
                auVar63._0_8_ = uVar29 ^ 0x8000000080000000;
                auVar63._8_4_ = -auVar62._8_4_;
                auVar63._12_4_ = -auVar62._12_4_;
                auVar88._8_4_ = 0x42b0c0a5;
                auVar88._0_8_ = 0x42b0c0a542b0c0a5;
                auVar88._12_4_ = 0x42b0c0a5;
                auVar113 = vminps_avx(auVar63,auVar88);
                auVar89._8_4_ = 0xc2b0c0a5;
                auVar89._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar89._12_4_ = 0xc2b0c0a5;
                auVar139 = vmaxps_avx(auVar113,auVar89);
                auVar90._0_4_ = fVar162 + auVar139._0_4_ * 1.442695;
                auVar90._4_4_ = fVar164 + auVar139._4_4_ * 1.442695;
                auVar90._8_4_ = fVar165 + auVar139._8_4_ * 1.442695;
                auVar90._12_4_ = fVar166 + auVar139._12_4_ * 1.442695;
                auVar155._0_4_ = (int)auVar90._0_4_;
                auVar155._4_4_ = (int)auVar90._4_4_;
                auVar155._8_4_ = (int)auVar90._8_4_;
                auVar155._12_4_ = (int)auVar90._12_4_;
                auVar144 = vcvtdq2ps_avx(auVar155);
                auVar113 = vcmpps_avx(auVar90,auVar144,1);
                auVar113 = vandps_avx(auVar113,auVar145);
                auVar113 = vsubps_avx(auVar144,auVar113);
                fVar167 = auVar139._0_4_ + auVar113._0_4_ * -0.6931472;
                fVar168 = auVar139._4_4_ + auVar113._4_4_ * -0.6931472;
                fVar169 = auVar139._8_4_ + auVar113._8_4_ * -0.6931472;
                fVar170 = auVar139._12_4_ + auVar113._12_4_ * -0.6931472;
                auVar91._0_4_ = (int)auVar113._0_4_;
                auVar91._4_4_ = (int)auVar113._4_4_;
                auVar91._8_4_ = (int)auVar113._8_4_;
                auVar91._12_4_ = (int)auVar113._12_4_;
                auVar113 = vpslld_avx(auVar91,0x17);
                auVar113 = vpaddd_avx(auVar113,auVar145);
                auVar64._0_4_ =
                     (fVar167 + 1.0 +
                     (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) * fVar167
                       + 0.041665796) * fVar167 + 0.16666666) * fVar167 + fVar162) *
                     fVar167 * fVar167) * auVar113._0_4_ + 1.0;
                auVar64._4_4_ =
                     (fVar168 + 1.0 +
                     (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168
                       + 0.041665796) * fVar168 + 0.16666666) * fVar168 + fVar164) *
                     fVar168 * fVar168) * auVar113._4_4_ + 1.0;
                auVar64._8_4_ =
                     (fVar169 + 1.0 +
                     (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) * fVar169
                       + 0.041665796) * fVar169 + 0.16666666) * fVar169 + fVar165) *
                     fVar169 * fVar169) * auVar113._8_4_ + 1.0;
                auVar64._12_4_ =
                     (fVar170 + 1.0 +
                     (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170
                       + 0.041665796) * fVar170 + 0.16666666) * fVar170 + fVar166) *
                     fVar170 * fVar170) * auVar113._12_4_ + 1.0;
                auVar62 = vdivps_avx(auVar145,auVar64);
                break;
              case 5:
                auVar140._8_4_ = 0x42b0c0a5;
                auVar140._0_8_ = 0x42b0c0a542b0c0a5;
                auVar140._12_4_ = 0x42b0c0a5;
                auVar113 = vminps_avx(auVar62,auVar140);
                auVar157._8_4_ = 0xc2b0c0a5;
                auVar157._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar157._12_4_ = 0xc2b0c0a5;
                auVar139 = vmaxps_avx(auVar157,auVar113);
                auVar149._0_4_ = fVar162 + auVar139._0_4_ * 1.442695;
                auVar149._4_4_ = fVar164 + auVar139._4_4_ * 1.442695;
                auVar149._8_4_ = fVar165 + auVar139._8_4_ * 1.442695;
                auVar149._12_4_ = fVar166 + auVar139._12_4_ * 1.442695;
                auVar171._0_4_ = (int)auVar149._0_4_;
                auVar171._4_4_ = (int)auVar149._4_4_;
                auVar171._8_4_ = (int)auVar149._8_4_;
                auVar171._12_4_ = (int)auVar149._12_4_;
                auVar144 = vcvtdq2ps_avx(auVar171);
                auVar113 = vcmpps_avx(auVar149,auVar144,1);
                auVar113 = vandps_avx(auVar113,auVar145);
                auVar113 = vsubps_avx(auVar144,auVar113);
                auVar172._0_4_ = auVar113._0_4_ * 0.6931472;
                auVar172._4_4_ = auVar113._4_4_ * 0.6931472;
                auVar172._8_4_ = auVar113._8_4_ * 0.6931472;
                auVar172._12_4_ = auVar113._12_4_ * 0.6931472;
                auVar144 = vsubps_avx(auVar139,auVar172);
                fVar167 = auVar144._0_4_;
                fVar168 = auVar144._4_4_;
                fVar169 = auVar144._8_4_;
                fVar170 = auVar144._12_4_;
                auVar150._0_4_ = (int)auVar113._0_4_;
                auVar150._4_4_ = (int)auVar113._4_4_;
                auVar150._8_4_ = (int)auVar113._8_4_;
                auVar150._12_4_ = (int)auVar113._12_4_;
                auVar113 = vpslld_avx(auVar150,0x17);
                auVar113 = vpaddd_avx(auVar113,auVar145);
                auVar151._0_4_ =
                     (fVar167 * fVar167 *
                      (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) *
                         fVar167 + 0.041665796) * fVar167 + 0.16666666) * fVar167 + fVar162) +
                     fVar167 + 1.0) * auVar113._0_4_ + 1.0;
                auVar151._4_4_ =
                     (fVar168 * fVar168 *
                      (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) *
                         fVar168 + 0.041665796) * fVar168 + 0.16666666) * fVar168 + fVar164) +
                     fVar168 + 1.0) * auVar113._4_4_ + 1.0;
                auVar151._8_4_ =
                     (fVar169 * fVar169 *
                      (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) *
                         fVar169 + 0.041665796) * fVar169 + 0.16666666) * fVar169 + fVar165) +
                     fVar169 + 1.0) * auVar113._8_4_ + 1.0;
                auVar151._12_4_ =
                     (fVar170 * fVar170 *
                      (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) *
                         fVar170 + 0.041665796) * fVar170 + 0.16666666) * fVar170 + fVar166) +
                     fVar170 + 1.0) * auVar113._12_4_ + 1.0;
                auVar83._8_4_ = 0x800000;
                auVar83._0_8_ = 0x80000000800000;
                auVar83._12_4_ = 0x800000;
                auVar113 = vmaxps_avx(auVar151,auVar83);
                auVar144 = vpsrld_avx(auVar113,0x17);
                auVar114._8_4_ = 0xffffff82;
                auVar114._0_8_ = 0xffffff82ffffff82;
                auVar114._12_4_ = 0xffffff82;
                auVar144 = vpaddd_avx(auVar144,auVar114);
                auVar115._8_4_ = 0x807fffff;
                auVar115._0_8_ = 0x807fffff807fffff;
                auVar115._12_4_ = 0x807fffff;
                auVar113 = vandps_avx(auVar113,auVar115);
                auVar148 = vorps_avx(auVar113,auVar143._0_16_);
                auVar139 = vcvtdq2ps_avx(auVar144);
                auVar116._8_4_ = 0x3f3504f3;
                auVar116._0_8_ = 0x3f3504f33f3504f3;
                auVar116._12_4_ = 0x3f3504f3;
                auVar144 = vcmpps_avx(auVar148,auVar116,1);
                auVar113 = vandps_avx(auVar144,auVar148);
                fVar167 = auVar148._0_4_ + -1.0 + auVar113._0_4_;
                fVar168 = auVar148._4_4_ + -1.0 + auVar113._4_4_;
                fVar169 = auVar148._8_4_ + -1.0 + auVar113._8_4_;
                fVar170 = auVar148._12_4_ + -1.0 + auVar113._12_4_;
                auVar113 = vandps_avx(auVar144,auVar145);
                auVar144 = vsubps_avx(auVar139,auVar113);
                auVar113 = vcmpps_avx(auVar151,_DAT_005f00d0,2);
                auVar84._0_4_ =
                     (fVar167 * fVar167 *
                      (((((((((fVar167 * 0.070376836 + -0.1151461) * fVar167 + 0.116769984) *
                             fVar167 + -0.12420141) * fVar167 + 0.14249323) * fVar167 + -0.16668057)
                          * fVar167 + 0.20000714) * fVar167 + -0.24999994) * fVar167 + 0.3333333) *
                       fVar167 + -0.5) + auVar144._0_4_ * 0.6931472 + fVar167) * -2.0;
                auVar84._4_4_ =
                     (fVar168 * fVar168 *
                      (((((((((fVar168 * 0.070376836 + -0.1151461) * fVar168 + 0.116769984) *
                             fVar168 + -0.12420141) * fVar168 + 0.14249323) * fVar168 + -0.16668057)
                          * fVar168 + 0.20000714) * fVar168 + -0.24999994) * fVar168 + 0.3333333) *
                       fVar168 + -0.5) + auVar144._4_4_ * 0.6931472 + fVar168) * -2.0;
                auVar84._8_4_ =
                     (fVar169 * fVar169 *
                      (((((((((fVar169 * 0.070376836 + -0.1151461) * fVar169 + 0.116769984) *
                             fVar169 + -0.12420141) * fVar169 + 0.14249323) * fVar169 + -0.16668057)
                          * fVar169 + 0.20000714) * fVar169 + -0.24999994) * fVar169 + 0.3333333) *
                       fVar169 + -0.5) + auVar144._8_4_ * 0.6931472 + fVar169) * -2.0;
                auVar84._12_4_ =
                     (fVar170 * fVar170 *
                      (((((((((fVar170 * 0.070376836 + -0.1151461) * fVar170 + 0.116769984) *
                             fVar170 + -0.12420141) * fVar170 + 0.14249323) * fVar170 + -0.16668057)
                          * fVar170 + 0.20000714) * fVar170 + -0.24999994) * fVar170 + 0.3333333) *
                       fVar170 + -0.5) + auVar144._12_4_ * 0.6931472 + fVar170) * -2.0;
                auVar117._8_4_ = 0x7fffffff;
                auVar117._0_8_ = 0x7fffffff7fffffff;
                auVar117._12_4_ = 0x7fffffff;
                auVar113 = vblendvps_avx(auVar84,auVar117,auVar113);
                auVar118._8_4_ = 0x42b0c0a5;
                auVar118._0_8_ = 0x42b0c0a542b0c0a5;
                auVar118._12_4_ = 0x42b0c0a5;
                auVar113 = vminps_avx(auVar113,auVar118);
                auVar119._8_4_ = 0xc2b0c0a5;
                auVar119._0_8_ = 0xc2b0c0a5c2b0c0a5;
                auVar119._12_4_ = 0xc2b0c0a5;
                auVar139 = vmaxps_avx(auVar113,auVar119);
                auVar120._0_4_ = auVar139._0_4_ * 1.442695 + fVar162;
                auVar120._4_4_ = auVar139._4_4_ * 1.442695 + fVar164;
                auVar120._8_4_ = auVar139._8_4_ * 1.442695 + fVar165;
                auVar120._12_4_ = auVar139._12_4_ * 1.442695 + fVar166;
                auVar152._0_4_ = (int)auVar120._0_4_;
                auVar152._4_4_ = (int)auVar120._4_4_;
                auVar152._8_4_ = (int)auVar120._8_4_;
                auVar152._12_4_ = (int)auVar120._12_4_;
                auVar144 = vcvtdq2ps_avx(auVar152);
                auVar113 = vcmpps_avx(auVar120,auVar144,1);
                auVar113 = vandps_avx(auVar113,auVar145);
                auVar113 = vsubps_avx(auVar144,auVar113);
                auVar153._0_4_ = auVar113._0_4_ * 0.6931472;
                auVar153._4_4_ = auVar113._4_4_ * 0.6931472;
                auVar153._8_4_ = auVar113._8_4_ * 0.6931472;
                auVar153._12_4_ = auVar113._12_4_ * 0.6931472;
                auVar144 = vsubps_avx(auVar139,auVar153);
                fVar167 = auVar144._0_4_;
                fVar168 = auVar144._4_4_;
                fVar169 = auVar144._8_4_;
                fVar170 = auVar144._12_4_;
                auVar143 = ZEXT1664(auVar143._0_16_);
                in_ZMM4 = ZEXT1664(CONCAT412(0x3e2aaaaa,CONCAT48(0x3e2aaaaa,0x3e2aaaaa3e2aaaaa)));
                auVar121._0_4_ = (int)auVar113._0_4_;
                auVar121._4_4_ = (int)auVar113._4_4_;
                auVar121._8_4_ = (int)auVar113._8_4_;
                auVar121._12_4_ = (int)auVar113._12_4_;
                auVar113 = vpslld_avx(auVar121,0x17);
                auVar113 = vpaddd_avx(auVar113,auVar145);
                auVar85._0_4_ =
                     (fVar167 + 1.0 +
                     (((((fVar167 * 0.00019875691 + 0.0013981999) * fVar167 + 0.008333452) * fVar167
                       + 0.041665796) * fVar167 + 0.16666666) * fVar167 + fVar162) *
                     fVar167 * fVar167) * auVar113._0_4_ + 1.0;
                auVar85._4_4_ =
                     (fVar168 + 1.0 +
                     (((((fVar168 * 0.00019875691 + 0.0013981999) * fVar168 + 0.008333452) * fVar168
                       + 0.041665796) * fVar168 + 0.16666666) * fVar168 + fVar164) *
                     fVar168 * fVar168) * auVar113._4_4_ + 1.0;
                auVar85._8_4_ =
                     (fVar169 + 1.0 +
                     (((((fVar169 * 0.00019875691 + 0.0013981999) * fVar169 + 0.008333452) * fVar169
                       + 0.041665796) * fVar169 + 0.16666666) * fVar169 + fVar165) *
                     fVar169 * fVar169) * auVar113._8_4_ + 1.0;
                auVar85._12_4_ =
                     (fVar170 + 1.0 +
                     (((((fVar170 * 0.00019875691 + 0.0013981999) * fVar170 + 0.008333452) * fVar170
                       + 0.041665796) * fVar170 + 0.16666666) * fVar170 + fVar166) *
                     fVar170 * fVar170) * auVar113._12_4_ + 1.0;
                auVar122._8_4_ = 0x40000000;
                auVar122._0_8_ = 0x4000000040000000;
                auVar122._12_4_ = 0x40000000;
                auVar113 = vdivps_avx(auVar122,auVar85);
                auVar86._0_4_ = auVar113._0_4_ + -1.0;
                auVar86._4_4_ = auVar113._4_4_ + -1.0;
                auVar86._8_4_ = auVar113._8_4_ + -1.0;
                auVar86._12_4_ = auVar113._12_4_ + -1.0;
                goto LAB_005850ce;
              case 6:
                pfVar47 = (float *)(this->super_Convolution1D).activation_params.data;
                fVar162 = *pfVar47;
                fVar164 = pfVar47[1];
                auVar92._0_4_ = fVar162 * auVar62._0_4_ + fVar164;
                auVar92._4_4_ = fVar162 * auVar62._4_4_ + fVar164;
                auVar92._8_4_ = fVar162 * auVar62._8_4_ + fVar164;
                auVar92._12_4_ = fVar162 * auVar62._12_4_ + fVar164;
                auVar113 = vmaxps_avx(auVar92,_DAT_005f00d0);
                auVar86 = vminps_avx(auVar113,auVar145);
LAB_005850ce:
                auVar62._0_4_ = auVar86._0_4_ * auVar62._0_4_;
                auVar62._4_4_ = auVar86._4_4_ * auVar62._4_4_;
                auVar62._8_4_ = auVar86._8_4_ * auVar62._8_4_;
                auVar62._12_4_ = auVar86._12_4_ * auVar62._12_4_;
              }
              if (iVar48 == 4) {
                *(undefined1 (*) [16])local_1b0 = auVar62;
                local_1b0 = (undefined1 (*) [32])((long)local_1b0 + 0x10);
              }
              if (iVar48 == 1) {
                *(int *)*local_1b0 = auVar62._0_4_;
                uVar7 = vextractps_avx(auVar62,1);
                *(undefined4 *)((long)*local_1b0 + (long)iVar24 * 4) = uVar7;
                uVar7 = vextractps_avx(auVar62,2);
                *(undefined4 *)((long)*local_1b0 + (long)(iVar24 * 2) * 4) = uVar7;
                uVar7 = vextractps_avx(auVar62,3);
                *(undefined4 *)((long)*local_1b0 + (long)(iVar24 * 3) * 4) = uVar7;
                local_1b0 = (undefined1 (*) [32])((long)*local_1b0 + 4);
              }
              local_1c8 = local_1c8 + 1;
              iVar39 = iVar39 + iVar45 * local_d8.elempack;
              local_188 = (Allocator *)((long)local_188 + lVar26 * 4);
              local_1b8 = local_1b8 + lVar26 * 4;
            } while (local_1c8 != lVar52);
          }
          local_140 = local_140 + 1;
        } while (local_140 != (uint)(iVar53 >> 2));
      }
      uVar33 = uVar37 * 8 + (iVar53 >> 2) * 4;
      local_68 = (ulong)uVar33;
      local_70 = (ulong)(uint)((int)(iVar23 - uVar33) / 2);
      if (1 < (int)(iVar23 - uVar33)) {
        iVar53 = local_d8.h * local_d8.elempack;
        uVar37 = top_blob->w;
        lVar52 = (long)(int)uVar37 * top_blob->elemsize;
        iVar23 = local_d8.elempack * iVar45;
        local_38 = (this->weight_data_tm).elemsize * (this->weight_data_tm).cstep;
        bVar58 = local_d8.elempack == 1;
        local_90 = CONCAT44(local_90._4_4_,iVar53) & 0xfffffffffffffff8;
        iVar24 = local_d8.elempack * iVar45;
        local_40 = top_blob->data;
        local_48 = (this->weight_data_tm).data;
        local_50 = (long)(int)uVar33;
        local_58 = lVar57 * 4;
        local_138 = 0;
        local_78 = local_70;
        do {
          pvVar10 = local_d8.data;
          if (0 < (int)uVar37) {
            lVar27 = local_50 + local_138 * 2;
            pfVar47 = (float *)((local_50 + local_138 * 2 + 1) * lVar52 + (long)local_40);
            pfVar50 = (float *)(lVar27 * lVar52 + (long)local_40);
            uVar33 = (uint)lVar27;
            uVar46 = uVar33 + 3;
            uVar55 = uVar33 + 7;
            if (-1 < (int)uVar33) {
              uVar46 = uVar33;
              uVar55 = uVar33;
            }
            iVar39 = uVar33 - (uVar55 & 0xfffffff8);
            iVar48 = (uVar33 - (uVar55 & 0xfffffff8)) + 3;
            if (-1 < iVar39) {
              iVar48 = iVar39;
            }
            pfVar30 = (float *)((((int)(uVar33 - (uVar46 & 0xfffffffc)) >> 1) + ((int)uVar55 >> 3) +
                                (iVar48 >> 2)) * local_38 + (long)local_48);
            lVar34 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
            pfVar31 = (float *)(this->super_Convolution1D).activation_params.data;
            local_120 = (long)(_func_int ***)local_d8.data + local_58;
            iVar48 = 0;
            local_150 = (Allocator *)local_d8.data;
            local_1f0 = 0;
            do {
              if (pvVar8 == (void *)0x0) {
                fVar162 = 0.0;
                fVar164 = 0.0;
              }
              else {
                pfVar32 = (float *)((long)pvVar8 + lVar27 * 4);
                fVar162 = *pfVar32;
                fVar164 = pfVar32[1];
              }
              pvVar41 = (void *)((long)iVar48 * 4);
              pfVar32 = pfVar30;
              if (iVar53 < 8) {
                uVar33 = 0;
                fVar76 = 0.0;
                fVar77 = 0.0;
                fVar78 = 0.0;
                fVar79 = 0.0;
                fVar80 = 0.0;
                fVar81 = 0.0;
                fVar173 = 0.0;
                fVar174 = 0.0;
                fVar165 = 0.0;
                fVar166 = 0.0;
                fVar167 = 0.0;
                fVar168 = 0.0;
                fVar169 = 0.0;
                fVar170 = 0.0;
                fVar61 = 0.0;
                fVar75 = 0.0;
              }
              else {
                fVar165 = 0.0;
                fVar166 = 0.0;
                fVar167 = 0.0;
                fVar168 = 0.0;
                fVar169 = 0.0;
                fVar170 = 0.0;
                fVar61 = 0.0;
                fVar75 = 0.0;
                fVar76 = 0.0;
                fVar77 = 0.0;
                fVar78 = 0.0;
                fVar79 = 0.0;
                fVar80 = 0.0;
                fVar81 = 0.0;
                fVar173 = 0.0;
                fVar174 = 0.0;
                iVar39 = 0;
                do {
                  lVar35 = (iVar39 / iVar4) * lVar34;
                  pfVar42 = (float *)((long)(_func_int ***)pvVar10 +
                                     lVar35 + (long)(iVar23 * (int)local_1f0) * 4);
                  auVar143 = in_ZMM4;
                  if ((iVar4 == 8) && (0 < iVar5)) {
                    pfVar42 = (float *)((long)(_func_int ***)pvVar10 +
                                       (long)(lVar35 + (long)pvVar41));
                    iVar38 = iVar5;
                    do {
                      auVar159._0_4_ = *pfVar42 * *pfVar32;
                      auVar159._4_4_ = pfVar42[1] * pfVar32[1];
                      auVar159._8_4_ = pfVar42[2] * pfVar32[2];
                      auVar159._12_4_ = pfVar42[3] * pfVar32[3];
                      auVar159._16_4_ = pfVar42[4] * pfVar32[4];
                      auVar159._20_4_ = pfVar42[5] * pfVar32[5];
                      auVar159._28_36_ = in_ZMM4._28_36_;
                      auVar159._24_4_ = pfVar42[6] * pfVar32[6];
                      auVar143 = ZEXT3264(auVar159._0_32_);
                      fVar76 = auVar159._0_4_ + fVar76;
                      fVar77 = auVar159._4_4_ + fVar77;
                      fVar78 = auVar159._8_4_ + fVar78;
                      fVar79 = auVar159._12_4_ + fVar79;
                      fVar80 = auVar159._16_4_ + fVar80;
                      fVar81 = auVar159._20_4_ + fVar81;
                      fVar173 = auVar159._24_4_ + fVar173;
                      fVar174 = in_ZMM4._28_4_ + fVar174;
                      fVar165 = *pfVar42 * pfVar32[8] + fVar165;
                      fVar166 = pfVar42[1] * pfVar32[9] + fVar166;
                      fVar167 = pfVar42[2] * pfVar32[10] + fVar167;
                      fVar168 = pfVar42[3] * pfVar32[0xb] + fVar168;
                      fVar169 = pfVar42[4] * pfVar32[0xc] + fVar169;
                      fVar170 = pfVar42[5] * pfVar32[0xd] + fVar170;
                      fVar61 = pfVar42[6] * pfVar32[0xe] + fVar61;
                      fVar75 = pfVar42[7] + fVar75;
                      pfVar32 = pfVar32 + 0x10;
                      pfVar42 = pfVar42 + iVar6 * 8;
                      iVar38 = iVar38 + -1;
                      in_ZMM4 = auVar143;
                    } while (iVar38 != 0);
                  }
                  in_ZMM4 = auVar143;
                  if ((iVar4 == 4) && (iVar38 = iVar5, 0 < iVar5)) {
                    do {
                      auVar161._0_4_ = *pfVar42 * *pfVar32;
                      auVar161._4_4_ = pfVar42[1] * pfVar32[1];
                      auVar161._8_4_ = pfVar42[2] * pfVar32[2];
                      auVar161._12_4_ = pfVar42[3] * pfVar32[3];
                      auVar161._16_4_ = pfVar42[lVar57 + 4] * pfVar32[4];
                      auVar161._20_4_ = pfVar42[lVar57 + 5] * pfVar32[5];
                      auVar161._28_36_ = auVar143._28_36_;
                      auVar161._24_4_ = pfVar42[lVar57 + 6] * pfVar32[6];
                      in_ZMM4 = ZEXT3264(auVar161._0_32_);
                      fVar76 = auVar161._0_4_ + fVar76;
                      fVar77 = auVar161._4_4_ + fVar77;
                      fVar78 = auVar161._8_4_ + fVar78;
                      fVar79 = auVar161._12_4_ + fVar79;
                      fVar80 = auVar161._16_4_ + fVar80;
                      fVar81 = auVar161._20_4_ + fVar81;
                      fVar173 = auVar161._24_4_ + fVar173;
                      fVar174 = auVar143._28_4_ + fVar174;
                      fVar165 = *pfVar42 * pfVar32[8] + fVar165;
                      fVar166 = pfVar42[1] * pfVar32[9] + fVar166;
                      fVar167 = pfVar42[2] * pfVar32[10] + fVar167;
                      fVar168 = pfVar42[3] * pfVar32[0xb] + fVar168;
                      fVar169 = pfVar42[lVar57 + 4] * pfVar32[0xc] + fVar169;
                      fVar170 = pfVar42[lVar57 + 5] * pfVar32[0xd] + fVar170;
                      fVar61 = pfVar42[lVar57 + 6] * pfVar32[0xe] + fVar61;
                      fVar75 = pfVar42[lVar57 + 7] + fVar75;
                      pfVar32 = pfVar32 + 0x10;
                      pfVar42 = pfVar42 + iVar6 * 4;
                      iVar38 = iVar38 + -1;
                      auVar143 = in_ZMM4;
                    } while (iVar38 != 0);
                  }
                  iVar38 = iVar5;
                  if (0 < iVar5 && bVar58) {
                    do {
                      auVar113 = vinsertps_avx(ZEXT416((uint)*pfVar42),
                                               ZEXT416((uint)pfVar42[lVar57]),0x10);
                      auVar113 = vinsertps_avx(auVar113,ZEXT416((uint)pfVar42[iVar21 * 2]),0x20);
                      auVar113 = vinsertps_avx(auVar113,ZEXT416((uint)pfVar42[iVar21 * 3]),0x30);
                      auVar144 = vinsertps_avx(ZEXT416((uint)pfVar42[iVar21 * 4]),
                                               ZEXT416((uint)pfVar42[iVar21 * 5]),0x10);
                      auVar144 = vinsertps_avx(auVar144,ZEXT416((uint)pfVar42[iVar21 * 6]),0x20);
                      auVar144 = vinsertps_avx(auVar144,ZEXT416((uint)pfVar42[iVar21 * 7]),0x30);
                      fVar175 = auVar113._0_4_ * *pfVar32;
                      fVar176 = auVar113._4_4_ * pfVar32[1];
                      fVar177 = auVar113._8_4_ * pfVar32[2];
                      fVar178 = auVar113._12_4_ * pfVar32[3];
                      fVar179 = auVar144._0_4_ * pfVar32[4];
                      fVar180 = auVar144._4_4_ * pfVar32[5];
                      fVar142 = auVar144._8_4_ * pfVar32[6];
                      in_ZMM4 = ZEXT2864(CONCAT424(fVar142,CONCAT420(fVar180,CONCAT416(fVar179,
                                                  CONCAT412(fVar178,CONCAT48(fVar177,CONCAT44(
                                                  fVar176,fVar175)))))));
                      fVar76 = fVar175 + fVar76;
                      fVar77 = fVar176 + fVar77;
                      fVar78 = fVar177 + fVar78;
                      fVar79 = fVar178 + fVar79;
                      fVar80 = fVar179 + fVar80;
                      fVar81 = fVar180 + fVar81;
                      fVar173 = fVar142 + fVar173;
                      fVar174 = fVar174 + 0.0;
                      fVar165 = auVar113._0_4_ * pfVar32[8] + fVar165;
                      fVar166 = auVar113._4_4_ * pfVar32[9] + fVar166;
                      fVar167 = auVar113._8_4_ * pfVar32[10] + fVar167;
                      fVar168 = auVar113._12_4_ * pfVar32[0xb] + fVar168;
                      fVar169 = auVar144._0_4_ * pfVar32[0xc] + fVar169;
                      fVar170 = auVar144._4_4_ * pfVar32[0xd] + fVar170;
                      fVar61 = auVar144._8_4_ * pfVar32[0xe] + fVar61;
                      fVar75 = auVar144._12_4_ + fVar75;
                      pfVar32 = pfVar32 + 0x10;
                      pfVar42 = pfVar42 + lVar25;
                      iVar38 = iVar38 + -1;
                    } while (iVar38 != 0);
                  }
                  iVar38 = iVar39 + 0xf;
                  iVar39 = iVar39 + 8;
                } while (iVar38 < iVar53);
                uVar33 = (uint)local_90;
              }
              auVar113 = ZEXT816(0) << 0x40;
              auVar143 = ZEXT1664(auVar113);
              if ((int)(uVar33 | 3) < iVar53) {
                pvVar41 = (void *)((long)(_func_int ***)pvVar10 + (long)pvVar41);
                auVar159 = ZEXT1664((undefined1  [16])0x0);
                uVar55 = uVar33;
                do {
                  lVar35 = ((int)uVar55 / iVar4) * lVar34;
                  pfVar42 = (float *)((long)(_func_int ***)pvVar10 +
                                     lVar35 + (long)(iVar23 * (int)local_1f0) * 4);
                  if ((iVar4 == 4) && (0 < iVar5)) {
                    pfVar42 = (float *)(lVar35 + (long)pvVar41);
                    iVar39 = iVar5;
                    do {
                      auVar143 = ZEXT1664(CONCAT412(pfVar42[3] * pfVar32[3] + auVar143._12_4_,
                                                    CONCAT48(pfVar42[2] * pfVar32[2] +
                                                             auVar143._8_4_,
                                                             CONCAT44(pfVar42[1] * pfVar32[1] +
                                                                      auVar143._4_4_,
                                                                      *pfVar42 * *pfVar32 +
                                                                      auVar143._0_4_))));
                      auVar159 = ZEXT1664(CONCAT412(pfVar42[3] * pfVar32[7] + auVar159._12_4_,
                                                    CONCAT48(pfVar42[2] * pfVar32[6] +
                                                             auVar159._8_4_,
                                                             CONCAT44(pfVar42[1] * pfVar32[5] +
                                                                      auVar159._4_4_,
                                                                      *pfVar42 * pfVar32[4] +
                                                                      auVar159._0_4_))));
                      pfVar32 = pfVar32 + 8;
                      pfVar42 = pfVar42 + iVar6 * 4;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  iVar39 = iVar5;
                  if (0 < iVar5 && bVar58) {
                    do {
                      auVar113 = vinsertps_avx(ZEXT416((uint)*pfVar42),
                                               ZEXT416((uint)pfVar42[lVar57]),0x10);
                      auVar113 = vinsertps_avx(auVar113,ZEXT416((uint)pfVar42[iVar21 * 2]),0x20);
                      auVar113 = vinsertps_avx(auVar113,ZEXT416((uint)pfVar42[iVar21 * 3]),0x30);
                      auVar143 = ZEXT1664(CONCAT412(auVar113._12_4_ * pfVar32[3] + auVar143._12_4_,
                                                    CONCAT48(auVar113._8_4_ * pfVar32[2] +
                                                             auVar143._8_4_,
                                                             CONCAT44(auVar113._4_4_ * pfVar32[1] +
                                                                      auVar143._4_4_,
                                                                      auVar113._0_4_ * *pfVar32 +
                                                                      auVar143._0_4_))));
                      auVar159 = ZEXT1664(CONCAT412(auVar113._12_4_ * pfVar32[7] + auVar159._12_4_,
                                                    CONCAT48(auVar113._8_4_ * pfVar32[6] +
                                                             auVar159._8_4_,
                                                             CONCAT44(auVar113._4_4_ * pfVar32[5] +
                                                                      auVar159._4_4_,
                                                                      auVar113._0_4_ * pfVar32[4] +
                                                                      auVar159._0_4_))));
                      pfVar32 = pfVar32 + 8;
                      pfVar42 = pfVar42 + lVar25;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar144 = auVar159._0_16_;
                  auVar113 = auVar143._0_16_;
                  uVar33 = uVar55 + 4;
                  iVar39 = uVar55 + 7;
                  uVar55 = uVar33;
                } while (iVar39 < iVar53);
              }
              else {
                auVar144 = (undefined1  [16])0x0;
              }
              local_e8._0_8_ = pvVar41;
              uVar28 = (ulong)uVar33;
              auVar93._0_4_ = fVar80 + fVar76;
              auVar93._4_4_ = fVar81 + fVar77;
              auVar93._8_4_ = fVar173 + fVar78;
              auVar93._12_4_ = fVar174 + fVar79;
              auVar139 = vshufpd_avx(auVar93,auVar93,1);
              auVar94._0_4_ = auVar139._0_4_ + auVar93._0_4_;
              auVar94._4_4_ = auVar139._4_4_ + auVar93._4_4_;
              auVar94._8_4_ = auVar139._8_4_ + auVar93._8_4_;
              auVar94._12_4_ = auVar139._12_4_ + auVar93._12_4_;
              auVar65._0_4_ = fVar169 + fVar165;
              auVar65._4_4_ = fVar170 + fVar166;
              auVar65._8_4_ = fVar61 + fVar167;
              auVar65._12_4_ = fVar75 + fVar168;
              auVar139 = vshufpd_avx(auVar65,auVar65,1);
              auVar66._0_4_ = auVar139._0_4_ + auVar65._0_4_;
              auVar66._4_4_ = auVar139._4_4_ + auVar65._4_4_;
              auVar66._8_4_ = auVar139._8_4_ + auVar65._8_4_;
              auVar66._12_4_ = auVar139._12_4_ + auVar65._12_4_;
              auVar139 = vshufpd_avx(auVar113,auVar113,1);
              auVar141._0_4_ = auVar139._0_4_ + auVar113._0_4_;
              auVar141._4_4_ = auVar139._4_4_ + auVar113._4_4_;
              auVar141._8_4_ = auVar139._8_4_ + auVar113._8_4_;
              auVar141._12_4_ = auVar139._12_4_ + auVar113._12_4_;
              auVar113 = vinsertps_avx(auVar66,auVar94,0x4c);
              auVar139 = vshufpd_avx(auVar144,auVar144,1);
              auVar123._0_4_ = auVar139._0_4_ + auVar144._0_4_;
              auVar123._4_4_ = auVar139._4_4_ + auVar144._4_4_;
              auVar123._8_4_ = auVar139._8_4_ + auVar144._8_4_;
              auVar123._12_4_ = auVar139._12_4_ + auVar144._12_4_;
              auVar144 = vinsertps_avx(auVar94,auVar66,0x1c);
              auVar139 = vinsertps_avx(auVar123,auVar141,0x4c);
              auVar148 = vinsertps_avx(auVar141,auVar123,0x1c);
              auVar143 = ZEXT1664(CONCAT412(auVar113._12_4_ + 0.0 +
                                            auVar144._12_4_ + auVar139._12_4_ + auVar148._12_4_,
                                            CONCAT48(auVar113._8_4_ + 0.0 +
                                                     auVar144._8_4_ + auVar139._8_4_ +
                                                     auVar148._8_4_,
                                                     CONCAT44(auVar113._4_4_ + fVar164 +
                                                              auVar144._4_4_ + auVar139._4_4_ +
                                                              auVar148._4_4_,
                                                              auVar113._0_4_ + fVar162 +
                                                              auVar144._0_4_ + auVar139._0_4_ +
                                                              auVar148._0_4_))));
              if ((int)(uVar33 | 1) < iVar53) {
                lVar35 = local_120 + lVar34 * uVar28;
                ppp_Var36 = (_func_int ***)((long)&local_150->_vptr_Allocator + lVar34 * uVar28);
                do {
                  if (0 < iVar5) {
                    lVar56 = 0;
                    iVar39 = iVar5;
                    do {
                      fVar162 = *(float *)((long)ppp_Var36 + lVar56);
                      fVar164 = *(float *)(lVar35 + lVar56);
                      auVar143 = ZEXT1664(CONCAT412(fVar162 * 0.0 + auVar143._12_4_ + fVar164 * 0.0,
                                                    CONCAT48(fVar162 * 0.0 + auVar143._8_4_ +
                                                             fVar164 * 0.0,
                                                             CONCAT44((float)((ulong)*(undefined8 *)
                                                                                      pfVar32 >>
                                                                             0x20) * fVar162 +
                                                                      auVar143._4_4_ +
                                                                      (float)((ulong)*(undefined8 *)
                                                                                      (pfVar32 + 2)
                                                                             >> 0x20) * fVar164,
                                                                      (float)*(undefined8 *)pfVar32
                                                                      * fVar162 + auVar143._0_4_ +
                                                                      (float)*(undefined8 *)
                                                                              (pfVar32 + 2) *
                                                                      fVar164))));
                      pfVar32 = pfVar32 + 4;
                      lVar56 = lVar56 + lVar25 * 4;
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  uVar28 = uVar28 + 2;
                  uVar33 = (uint)uVar28;
                  lVar35 = lVar35 + lVar34 * 2;
                  ppp_Var36 = (_func_int ***)((long)ppp_Var36 + lVar34 * 2);
                } while ((int)(uVar33 | 1) < iVar53);
              }
              auVar113 = auVar143._0_16_;
              if ((int)uVar33 < iVar53) {
                uVar28 = (ulong)uVar33;
                ppp_Var36 = (_func_int ***)((long)&local_150->_vptr_Allocator + lVar34 * uVar28);
                do {
                  ppp_Var44 = ppp_Var36;
                  iVar39 = iVar5;
                  if (0 < iVar5) {
                    do {
                      fVar162 = *(float *)ppp_Var44;
                      auVar143 = ZEXT1664(CONCAT412(fVar162 * 0.0 + auVar143._12_4_,
                                                    CONCAT48(fVar162 * 0.0 + auVar143._8_4_,
                                                             CONCAT44((float)((ulong)*(undefined8 *)
                                                                                      pfVar32 >>
                                                                             0x20) * fVar162 +
                                                                      auVar143._4_4_,
                                                                      (float)*(undefined8 *)pfVar32
                                                                      * fVar162 + auVar143._0_4_))))
                      ;
                      pfVar32 = pfVar32 + 2;
                      ppp_Var44 = (_func_int ***)((long)ppp_Var44 + lVar25 * 4);
                      iVar39 = iVar39 + -1;
                    } while (iVar39 != 0);
                  }
                  auVar113 = auVar143._0_16_;
                  uVar28 = uVar28 + 1;
                  ppp_Var36 = (_func_int ***)((long)ppp_Var36 + lVar34);
                } while ((int)uVar28 < iVar53);
              }
              iVar39 = (int)local_80 + -1;
              fVar164 = auVar113._0_4_;
              fVar162 = fVar164;
              switch(iVar39) {
              case 0:
                auVar144 = vmaxss_avx(auVar113,ZEXT416(0));
                fVar162 = auVar144._0_4_;
                break;
              case 1:
                auVar144 = vcmpss_avx(ZEXT816(0) << 0x40,auVar113,1);
                auVar96._8_4_ = 0x3f800000;
                auVar96._0_8_ = 0x3f8000003f800000;
                auVar96._12_4_ = 0x3f800000;
                auVar144 = vblendvps_avx(ZEXT416((uint)*pfVar31),auVar96,auVar144);
                fVar162 = auVar144._0_4_;
                goto LAB_0058597d;
              case 2:
                auVar144 = vmaxss_avx(auVar113,ZEXT416((uint)*pfVar31));
                fVar162 = auVar144._0_4_;
                if (pfVar31[1] < auVar144._0_4_) {
                  fVar162 = pfVar31[1];
                }
                break;
              case 3:
                auVar144 = vminss_avx(auVar113,ZEXT416(0x42b0c0a5));
                auVar67._0_8_ = auVar144._0_8_ ^ 0x8000000080000000;
                auVar67._8_4_ = auVar144._8_4_ ^ 0x80000000;
                auVar67._12_4_ = auVar144._12_4_ ^ 0x80000000;
                auVar144 = vcmpss_avx(auVar144,ZEXT416(0xc2b0c0a5),1);
                auVar95._8_4_ = 0x42b0c0a5;
                auVar95._0_8_ = 0x42b0c0a542b0c0a5;
                auVar95._12_4_ = 0x42b0c0a5;
                auVar144 = vblendvps_avx(auVar67,auVar95,auVar144);
                fVar162 = expf(auVar144._0_4_);
                fVar162 = 1.0 / (fVar162 + 1.0);
                break;
              case 4:
                fVar162 = expf(fVar164);
                fVar162 = logf(fVar162 + 1.0);
                fVar162 = tanhf(fVar162);
LAB_0058597d:
                fVar162 = fVar162 * fVar164;
                break;
              case 5:
                fVar165 = *pfVar31;
                fVar166 = -pfVar31[1] / fVar165;
                fVar162 = 0.0;
                if ((fVar166 <= fVar164) && (fVar162 = fVar164, fVar164 <= fVar166 + 1.0 / fVar165))
                {
                  fVar162 = fVar165 * fVar164 + pfVar31[1];
                  goto LAB_0058597d;
                }
              }
              auVar113 = vmovshdup_avx(auVar113);
              in_ZMM4 = ZEXT1664(auVar113);
              fVar165 = auVar113._0_4_;
              fVar164 = fVar165;
              switch(iVar39) {
              case 0:
                auVar113 = vmaxss_avx(auVar113,ZEXT416(0));
                fVar164 = auVar113._0_4_;
                break;
              case 1:
                auVar113 = vcmpss_avx(ZEXT816(0) << 0x40,auVar113,1);
                auVar98._8_4_ = 0x3f800000;
                auVar98._0_8_ = 0x3f8000003f800000;
                auVar98._12_4_ = 0x3f800000;
                auVar113 = vblendvps_avx(ZEXT416((uint)*pfVar31),auVar98,auVar113);
                fVar164 = auVar113._0_4_ * fVar165;
                break;
              case 2:
                auVar113 = vmaxss_avx(auVar113,ZEXT416((uint)*pfVar31));
                fVar164 = auVar113._0_4_;
                if (pfVar31[1] < auVar113._0_4_) {
                  fVar164 = pfVar31[1];
                }
                break;
              case 3:
                auVar144 = vminss_avx(auVar113,ZEXT416(0x42b0c0a5));
                auVar68._0_8_ = auVar144._0_8_ ^ 0x8000000080000000;
                auVar68._8_4_ = auVar144._8_4_ ^ 0x80000000;
                auVar68._12_4_ = auVar144._12_4_ ^ 0x80000000;
                auVar144 = vcmpss_avx(auVar144,ZEXT416(0xc2b0c0a5),1);
                auVar97._8_4_ = 0x42b0c0a5;
                auVar97._0_8_ = 0x42b0c0a542b0c0a5;
                auVar97._12_4_ = 0x42b0c0a5;
                auVar144 = vblendvps_avx(auVar68,auVar97,auVar144);
                in_ZMM4 = ZEXT1664(auVar113);
                fVar164 = expf(auVar144._0_4_);
                fVar164 = 1.0 / (fVar164 + 1.0);
                break;
              case 4:
                in_ZMM4 = ZEXT1664(auVar113);
                fVar164 = expf(fVar165);
                fVar164 = logf(fVar164 + 1.0);
                fVar164 = tanhf(fVar164);
                local_e8 = auVar113;
                fVar164 = fVar164 * fVar165;
                break;
              case 5:
                fVar166 = *pfVar31;
                fVar167 = -pfVar31[1] / fVar166;
                fVar164 = 0.0;
                if ((fVar167 <= fVar165) && (fVar164 = fVar165, fVar165 <= fVar167 + 1.0 / fVar166))
                {
                  fVar164 = (fVar166 * fVar165 + pfVar31[1]) * fVar165;
                }
              }
              *pfVar50 = fVar162;
              *pfVar47 = fVar164;
              pfVar50 = pfVar50 + 1;
              pfVar47 = pfVar47 + 1;
              local_1f0 = local_1f0 + 1;
              iVar48 = iVar48 + iVar24;
              local_120 = local_120 + lVar26 * 4;
              local_150 = (Allocator *)((long)&local_150->_vptr_Allocator + lVar26 * 4);
            } while (local_1f0 != uVar37);
          }
          local_138 = local_138 + 1;
        } while (local_138 != local_78);
      }
      iVar23 = (int)local_68 + (int)local_70 * 2;
      if (iVar23 < (int)local_88) {
        pvVar10 = top_blob->data;
        iVar24 = top_blob->w;
        sVar11 = top_blob->elemsize;
        sVar12 = (this->weight_data_tm).elemsize;
        sVar13 = (this->weight_data_tm).cstep;
        bVar58 = 0 < iVar5;
        local_128 = uVar20 & 0xfffffff8;
        local_190 = (ulong)iVar23;
        pvVar41 = (this->weight_data_tm).data;
        do {
          pvVar19 = local_d8.data;
          if (0 < (int)local_60) {
            pfVar47 = (float *)((long)iVar24 * sVar11 * local_190 + (long)pvVar10);
            uVar33 = (uint)local_190;
            uVar55 = uVar33 + 3;
            uVar37 = uVar33 + 7;
            if (-1 < (int)uVar33) {
              uVar55 = uVar33;
              uVar37 = uVar33;
            }
            iVar53 = uVar33 - (uVar37 & 0xfffffff8);
            iVar23 = (uVar33 - (uVar37 & 0xfffffff8)) + 3;
            if (-1 < iVar53) {
              iVar23 = iVar53;
            }
            pfVar31 = (float *)((long)(int)((uVar33 - (((uint)(local_190 >> 0x1f) & 1) + uVar33 &
                                                      0xfffffffe)) + ((int)uVar37 >> 3) +
                                            (int)(uVar33 - (uVar55 & 0xfffffffc)) / 2 +
                                           (iVar23 >> 2)) * sVar12 * sVar13 + (long)pvVar41);
            lVar52 = (long)local_d8.w * CONCAT44(local_d8.elemsize._4_4_,(int)local_d8.elemsize);
            pfVar50 = (float *)(this->super_Convolution1D).activation_params.data;
            local_1a0 = (void *)((long)(_func_int ***)local_d8.data + lVar57 * 4);
            iVar23 = 0;
            local_188 = (Allocator *)local_d8.data;
            auVar18._8_8_ = 0;
            auVar18._0_8_ = local_e8._8_8_;
            local_e8 = auVar18 << 0x40;
            do {
              if (pvVar8 == (void *)0x0) {
                fVar162 = 0.0;
              }
              else {
                fVar162 = *(float *)((long)pvVar8 + local_190 * 4);
              }
              pfVar30 = pfVar31;
              if ((int)uVar20 < 8) {
                fVar164 = 0.0;
                fVar165 = 0.0;
                fVar166 = 0.0;
                fVar167 = 0.0;
                fVar168 = 0.0;
                fVar169 = 0.0;
                fVar170 = 0.0;
                fVar61 = 0.0;
                uVar33 = 0;
              }
              else {
                fVar164 = 0.0;
                fVar165 = 0.0;
                fVar166 = 0.0;
                fVar167 = 0.0;
                fVar168 = 0.0;
                fVar169 = 0.0;
                fVar170 = 0.0;
                fVar61 = 0.0;
                iVar53 = 0;
                do {
                  lVar27 = (iVar53 / iVar4) * lVar52;
                  if (iVar4 == 8 && bVar58) {
                    pfVar32 = (float *)((long)(_func_int ***)pvVar19 + lVar27 + (long)iVar23 * 4);
                    iVar48 = iVar5;
                    do {
                      fVar164 = *pfVar30 * *pfVar32 + fVar164;
                      fVar165 = pfVar30[1] * pfVar32[1] + fVar165;
                      fVar166 = pfVar30[2] * pfVar32[2] + fVar166;
                      fVar167 = pfVar30[3] * pfVar32[3] + fVar167;
                      fVar168 = pfVar30[4] * pfVar32[4] + fVar168;
                      fVar169 = pfVar30[5] * pfVar32[5] + fVar169;
                      fVar170 = pfVar30[6] * pfVar32[6] + fVar170;
                      fVar61 = pfVar30[7] + fVar61;
                      pfVar30 = pfVar30 + 8;
                      pfVar32 = pfVar32 + iVar6 * 8;
                      iVar48 = iVar48 + -1;
                    } while (iVar48 != 0);
                  }
                  else {
                    pfVar32 = (float *)((long)(_func_int ***)pvVar19 +
                                       lVar27 + (long)(iVar4 * iVar45 * local_e8._0_4_) * 4);
                  }
                  iVar48 = iVar5;
                  if (iVar4 == 4 && bVar58) {
                    do {
                      fVar164 = *pfVar32 * *pfVar30 + fVar164;
                      fVar165 = pfVar32[1] * pfVar30[1] + fVar165;
                      fVar166 = pfVar32[2] * pfVar30[2] + fVar166;
                      fVar167 = pfVar32[3] * pfVar30[3] + fVar167;
                      fVar168 = pfVar32[lVar57 + 4] * pfVar30[4] + fVar168;
                      fVar169 = pfVar32[lVar57 + 5] * pfVar30[5] + fVar169;
                      fVar170 = pfVar32[lVar57 + 6] * pfVar30[6] + fVar170;
                      fVar61 = pfVar32[lVar57 + 7] + fVar61;
                      pfVar30 = pfVar30 + 8;
                      pfVar32 = pfVar32 + iVar6 * 4;
                      iVar48 = iVar48 + -1;
                    } while (iVar48 != 0);
                  }
                  iVar48 = iVar5;
                  if (iVar4 == 1 && bVar58) {
                    do {
                      auVar113 = vinsertps_avx(ZEXT416((uint)*pfVar32),
                                               ZEXT416((uint)pfVar32[lVar57]),0x10);
                      auVar113 = vinsertps_avx(auVar113,ZEXT416((uint)pfVar32[iVar21 * 2]),0x20);
                      auVar113 = vinsertps_avx(auVar113,ZEXT416((uint)pfVar32[iVar21 * 3]),0x30);
                      auVar144 = vinsertps_avx(ZEXT416((uint)pfVar32[iVar21 * 4]),
                                               ZEXT416((uint)pfVar32[iVar21 * 5]),0x10);
                      auVar144 = vinsertps_avx(auVar144,ZEXT416((uint)pfVar32[iVar21 * 6]),0x20);
                      auVar144 = vinsertps_avx(auVar144,ZEXT416((uint)pfVar32[iVar21 * 7]),0x30);
                      fVar164 = auVar113._0_4_ * *pfVar30 + fVar164;
                      fVar165 = auVar113._4_4_ * pfVar30[1] + fVar165;
                      fVar166 = auVar113._8_4_ * pfVar30[2] + fVar166;
                      fVar167 = auVar113._12_4_ * pfVar30[3] + fVar167;
                      fVar168 = auVar144._0_4_ * pfVar30[4] + fVar168;
                      fVar169 = auVar144._4_4_ * pfVar30[5] + fVar169;
                      fVar170 = auVar144._8_4_ * pfVar30[6] + fVar170;
                      fVar61 = auVar144._12_4_ + fVar61;
                      pfVar30 = pfVar30 + 8;
                      pfVar32 = pfVar32 + lVar25;
                      iVar48 = iVar48 + -1;
                    } while (iVar48 != 0);
                  }
                  iVar48 = iVar53 + 0xf;
                  iVar53 = iVar53 + 8;
                  uVar33 = local_128;
                } while (iVar48 < (int)uVar20);
              }
              auVar113 = ZEXT816(0) << 0x40;
              auVar143 = ZEXT1664(auVar113);
              if ((int)(uVar33 | 3) < (int)uVar20) {
                uVar37 = uVar33;
                do {
                  lVar27 = ((int)uVar37 / iVar4) * lVar52;
                  if (iVar4 == 4 && bVar58) {
                    pfVar32 = (float *)((long)(_func_int ***)pvVar19 + lVar27 + (long)iVar23 * 4);
                    iVar53 = iVar5;
                    do {
                      auVar143 = ZEXT1664(CONCAT412(pfVar30[3] * pfVar32[3] + auVar143._12_4_,
                                                    CONCAT48(pfVar30[2] * pfVar32[2] +
                                                             auVar143._8_4_,
                                                             CONCAT44(pfVar30[1] * pfVar32[1] +
                                                                      auVar143._4_4_,
                                                                      *pfVar30 * *pfVar32 +
                                                                      auVar143._0_4_))));
                      pfVar30 = pfVar30 + 4;
                      pfVar32 = pfVar32 + iVar6 * 4;
                      iVar53 = iVar53 + -1;
                    } while (iVar53 != 0);
                  }
                  else {
                    pfVar32 = (float *)((long)(_func_int ***)pvVar19 +
                                       lVar27 + (long)(iVar4 * iVar45 * local_e8._0_4_) * 4);
                  }
                  iVar53 = iVar5;
                  if (iVar4 == 1 && bVar58) {
                    do {
                      auVar113 = vinsertps_avx(ZEXT416((uint)*pfVar32),
                                               ZEXT416((uint)pfVar32[lVar57]),0x10);
                      auVar113 = vinsertps_avx(auVar113,ZEXT416((uint)pfVar32[iVar21 * 2]),0x20);
                      auVar113 = vinsertps_avx(auVar113,ZEXT416((uint)pfVar32[iVar21 * 3]),0x30);
                      auVar143 = ZEXT1664(CONCAT412(auVar113._12_4_ * pfVar30[3] + auVar143._12_4_,
                                                    CONCAT48(auVar113._8_4_ * pfVar30[2] +
                                                             auVar143._8_4_,
                                                             CONCAT44(auVar113._4_4_ * pfVar30[1] +
                                                                      auVar143._4_4_,
                                                                      auVar113._0_4_ * *pfVar30 +
                                                                      auVar143._0_4_))));
                      pfVar30 = pfVar30 + 4;
                      pfVar32 = pfVar32 + lVar25;
                      iVar53 = iVar53 + -1;
                    } while (iVar53 != 0);
                  }
                  auVar113 = auVar143._0_16_;
                  uVar33 = uVar37 + 4;
                  iVar53 = uVar37 + 7;
                  uVar37 = uVar33;
                } while (iVar53 < (int)uVar20);
              }
              uVar28 = (ulong)uVar33;
              auVar69._0_4_ = fVar168 + fVar164;
              auVar69._4_4_ = fVar169 + fVar165;
              auVar69._8_4_ = fVar170 + fVar166;
              auVar69._12_4_ = fVar61 + fVar167;
              auVar144 = vshufpd_avx(auVar69,auVar69,1);
              auVar70._0_4_ = auVar144._0_4_ + auVar69._0_4_;
              auVar70._4_4_ = auVar144._4_4_ + auVar69._4_4_;
              auVar70._8_4_ = auVar144._8_4_ + auVar69._8_4_;
              auVar70._12_4_ = auVar144._12_4_ + auVar69._12_4_;
              auVar144 = vmovshdup_avx(auVar70);
              auVar139 = vshufpd_avx(auVar113,auVar113,1);
              auVar99._0_4_ = auVar139._0_4_ + auVar113._0_4_;
              auVar99._4_4_ = auVar139._4_4_ + auVar113._4_4_;
              auVar99._8_4_ = auVar139._8_4_ + auVar113._8_4_;
              auVar99._12_4_ = auVar139._12_4_ + auVar113._12_4_;
              auVar113 = vmovshdup_avx(auVar99);
              auVar143 = ZEXT464((uint)(auVar144._0_4_ + fVar162 +
                                       auVar70._0_4_ + auVar113._0_4_ + auVar99._0_4_));
              if ((int)(uVar33 | 1) < (int)uVar20) {
                pvVar43 = (void *)((long)local_1a0 + lVar52 * uVar28);
                ppp_Var36 = (_func_int ***)((long)&local_188->_vptr_Allocator + lVar52 * uVar28);
                do {
                  if (0 < iVar5) {
                    lVar27 = 0;
                    iVar53 = iVar5;
                    do {
                      auVar143 = ZEXT464((uint)(*pfVar30 * *(float *)((long)ppp_Var36 + lVar27) +
                                                auVar143._0_4_ +
                                               pfVar30[1] * *(float *)((long)pvVar43 + lVar27)));
                      pfVar30 = pfVar30 + 2;
                      lVar27 = lVar27 + lVar25 * 4;
                      iVar53 = iVar53 + -1;
                    } while (iVar53 != 0);
                  }
                  uVar28 = uVar28 + 2;
                  uVar33 = (uint)uVar28;
                  pvVar43 = (void *)((long)pvVar43 + lVar52 * 2);
                  ppp_Var36 = (_func_int ***)((long)ppp_Var36 + lVar52 * 2);
                } while ((int)(uVar33 | 1) < (int)uVar20);
              }
              auVar113 = auVar143._0_16_;
              if ((int)uVar33 < (int)uVar20) {
                uVar28 = (ulong)uVar33;
                ppp_Var36 = (_func_int ***)((long)&local_188->_vptr_Allocator + lVar52 * uVar28);
                do {
                  ppp_Var44 = ppp_Var36;
                  iVar53 = iVar5;
                  if (0 < iVar5) {
                    do {
                      auVar143 = ZEXT464((uint)(*pfVar30 * *(float *)ppp_Var44 + auVar143._0_4_));
                      pfVar30 = pfVar30 + 1;
                      ppp_Var44 = (_func_int ***)((long)ppp_Var44 + lVar25 * 4);
                      iVar53 = iVar53 + -1;
                    } while (iVar53 != 0);
                  }
                  auVar113 = auVar143._0_16_;
                  uVar28 = uVar28 + 1;
                  ppp_Var36 = (_func_int ***)((long)ppp_Var36 + lVar52);
                } while ((int)uVar28 < (int)uVar20);
              }
              fVar164 = auVar113._0_4_;
              fVar162 = fVar164;
              switch((int)local_80) {
              case 1:
                auVar113 = vmaxss_avx(auVar113,ZEXT416(0));
                fVar162 = auVar113._0_4_;
                break;
              case 2:
                auVar113 = vcmpss_avx(ZEXT416(0) << 0x20,auVar113,1);
                auVar101._8_4_ = 0x3f800000;
                auVar101._0_8_ = 0x3f8000003f800000;
                auVar101._12_4_ = 0x3f800000;
                auVar113 = vblendvps_avx(ZEXT416((uint)*pfVar50),auVar101,auVar113);
                fVar162 = auVar113._0_4_ * fVar164;
                break;
              case 3:
                auVar113 = vmaxss_avx(auVar113,ZEXT416((uint)*pfVar50));
                fVar162 = auVar113._0_4_;
                if (pfVar50[1] < auVar113._0_4_) {
                  fVar162 = pfVar50[1];
                }
                break;
              case 4:
                auVar113 = vminss_avx(auVar113,ZEXT416(0x42b0c0a5));
                auVar71._0_8_ = auVar113._0_8_ ^ 0x8000000080000000;
                auVar71._8_4_ = auVar113._8_4_ ^ 0x80000000;
                auVar71._12_4_ = auVar113._12_4_ ^ 0x80000000;
                auVar113 = vcmpss_avx(auVar113,ZEXT416(0xc2b0c0a5),1);
                auVar100._8_4_ = 0x42b0c0a5;
                auVar100._0_8_ = 0x42b0c0a542b0c0a5;
                auVar100._12_4_ = 0x42b0c0a5;
                auVar113 = vblendvps_avx(auVar71,auVar100,auVar113);
                fVar162 = expf(auVar113._0_4_);
                fVar162 = 1.0 / (fVar162 + 1.0);
                break;
              case 5:
                fVar162 = expf(fVar164);
                fVar162 = logf(fVar162 + 1.0);
                fVar162 = tanhf(fVar162);
                fVar162 = fVar162 * fVar164;
                break;
              case 6:
                fVar165 = *pfVar50;
                fVar166 = -pfVar50[1] / fVar165;
                fVar162 = 0.0;
                if ((fVar166 <= fVar164) && (fVar162 = fVar164, fVar164 <= fVar166 + 1.0 / fVar165))
                {
                  fVar162 = (fVar165 * fVar164 + pfVar50[1]) * fVar164;
                }
              }
              *pfVar47 = fVar162;
              pfVar47 = pfVar47 + 1;
              lVar27 = local_e8._0_8_ + 1;
              iVar23 = iVar23 + iVar45 * iVar4;
              local_1a0 = (void *)((long)local_1a0 + lVar26 * 4);
              local_188 = (Allocator *)((long)&local_188->_vptr_Allocator + lVar26 * 4);
              local_e8._0_8_ = lVar27;
            } while (lVar27 != local_60);
          }
          local_190 = local_190 + 1;
        } while (local_190 != local_88);
      }
      iVar45 = 0;
    }
  }
  piVar17 = (int *)CONCAT44(local_d8.refcount._4_4_,(int)local_d8.refcount);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if (local_d8.allocator == (Allocator *)0x0) {
        if ((Allocator *)local_d8.data != (Allocator *)0x0) {
          free(local_d8.data);
        }
      }
      else {
        (*(local_d8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar45;
}

Assistant:

int Convolution1D_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    const int outw = (w - kernel_extent_w) / stride_w + 1;
    const int outh = num_output / out_elempack;

    top_blob.create(outw, outh, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    convolution1d_packed(bottom_blob_bordered, top_blob, weight_data_tm, bias_data, kernel_w, dilation_w, stride_w, activation_type, activation_params, opt);

    return 0;
}